

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersectorK<4,8>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  ulong uVar11;
  Primitive PVar12;
  Geometry *pGVar13;
  __int_type_conflict _Var14;
  long lVar15;
  long lVar16;
  long lVar17;
  RTCFilterFunctionN p_Var18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  bool bVar59;
  bool bVar60;
  bool bVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  bool bVar64;
  bool bVar65;
  bool bVar66;
  bool bVar67;
  bool bVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  bool bVar77;
  uint uVar78;
  uint uVar79;
  uint uVar80;
  ulong uVar81;
  long lVar82;
  long lVar83;
  uint uVar84;
  ulong uVar85;
  long lVar87;
  bool bVar88;
  float fVar89;
  float fVar115;
  float fVar116;
  vint4 bi_2;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar117;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar90;
  undefined1 auVar104 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar105 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar118;
  float fVar147;
  float fVar148;
  vint4 bi_1;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar149;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar150;
  float fVar175;
  float fVar176;
  vint4 bi;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  float fVar177;
  float fVar202;
  float fVar203;
  vint4 ai_1;
  undefined1 auVar178 [16];
  float fVar204;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar205;
  float fVar229;
  float fVar230;
  vint4 ai_2;
  undefined1 auVar206 [16];
  float fVar231;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar232;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  float fVar233;
  float fVar251;
  float fVar252;
  undefined1 auVar234 [16];
  float fVar253;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar259 [16];
  undefined1 auVar264 [32];
  vint4 ai;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [32];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  float fVar298;
  float fVar310;
  float fVar311;
  undefined1 auVar299 [16];
  float fVar312;
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [32];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [32];
  float fVar321;
  float fVar322;
  float fVar329;
  float fVar331;
  undefined1 auVar323 [16];
  float fVar330;
  float fVar332;
  float fVar333;
  float fVar334;
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar353;
  float fVar354;
  undefined1 auVar346 [16];
  float fVar355;
  undefined1 auVar347 [16];
  undefined1 auVar349 [16];
  undefined1 auVar348 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  float fVar356;
  float fVar357;
  undefined1 auVar352 [32];
  float fVar358;
  float fVar366;
  float fVar367;
  vfloat4 a0;
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  float fVar368;
  undefined1 auVar369 [16];
  float fVar377;
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  float fVar375;
  float fVar376;
  undefined1 auVar374 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_711;
  undefined1 local_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float local_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float local_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  uint local_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined1 local_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  uint auStack_470 [4];
  RTCFilterFunctionNArguments local_460;
  undefined1 local_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [8];
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  undefined1 local_330 [8];
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  float afStack_300 [8];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar86;
  undefined1 auVar201 [32];
  undefined1 auVar373 [32];
  
  PVar12 = prim[1];
  uVar81 = (ulong)(byte)PVar12;
  lVar82 = uVar81 * 0x25;
  auVar135 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar135 = vinsertps_avx(auVar135,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar126 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar126 = vinsertps_avx(auVar126,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar90 = *(float *)(prim + lVar82 + 0x12);
  auVar135 = vsubps_avx(auVar135,*(undefined1 (*) [16])(prim + lVar82 + 6));
  auVar119._0_4_ = fVar90 * auVar135._0_4_;
  auVar119._4_4_ = fVar90 * auVar135._4_4_;
  auVar119._8_4_ = fVar90 * auVar135._8_4_;
  auVar119._12_4_ = fVar90 * auVar135._12_4_;
  auVar265._0_4_ = fVar90 * auVar126._0_4_;
  auVar265._4_4_ = fVar90 * auVar126._4_4_;
  auVar265._8_4_ = fVar90 * auVar126._8_4_;
  auVar265._12_4_ = fVar90 * auVar126._12_4_;
  auVar135 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 4 + 6)));
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 5 + 6)));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar249 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 6 + 6)));
  auVar249 = vcvtdq2ps_avx(auVar249);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xf + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar12 * 0x10 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar81 + 6)));
  auVar194 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x1a + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar134 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x1b + 6)));
  auVar194 = vcvtdq2ps_avx(auVar194);
  auVar193 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x1c + 6)));
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar193 = vcvtdq2ps_avx(auVar193);
  auVar106 = vshufps_avx(auVar265,auVar265,0);
  auVar164 = vshufps_avx(auVar265,auVar265,0x55);
  auVar22 = vshufps_avx(auVar265,auVar265,0xaa);
  fVar90 = auVar22._0_4_;
  fVar150 = auVar22._4_4_;
  fVar175 = auVar22._8_4_;
  fVar176 = auVar22._12_4_;
  fVar205 = auVar164._0_4_;
  fVar229 = auVar164._4_4_;
  fVar230 = auVar164._8_4_;
  fVar231 = auVar164._12_4_;
  fVar177 = auVar106._0_4_;
  fVar202 = auVar106._4_4_;
  fVar203 = auVar106._8_4_;
  fVar204 = auVar106._12_4_;
  auVar335._0_4_ = fVar177 * auVar135._0_4_ + fVar205 * auVar126._0_4_ + fVar90 * auVar249._0_4_;
  auVar335._4_4_ = fVar202 * auVar135._4_4_ + fVar229 * auVar126._4_4_ + fVar150 * auVar249._4_4_;
  auVar335._8_4_ = fVar203 * auVar135._8_4_ + fVar230 * auVar126._8_4_ + fVar175 * auVar249._8_4_;
  auVar335._12_4_ =
       fVar204 * auVar135._12_4_ + fVar231 * auVar126._12_4_ + fVar176 * auVar249._12_4_;
  auVar346._0_4_ = fVar177 * auVar19._0_4_ + fVar205 * auVar20._0_4_ + auVar21._0_4_ * fVar90;
  auVar346._4_4_ = fVar202 * auVar19._4_4_ + fVar229 * auVar20._4_4_ + auVar21._4_4_ * fVar150;
  auVar346._8_4_ = fVar203 * auVar19._8_4_ + fVar230 * auVar20._8_4_ + auVar21._8_4_ * fVar175;
  auVar346._12_4_ = fVar204 * auVar19._12_4_ + fVar231 * auVar20._12_4_ + auVar21._12_4_ * fVar176;
  auVar266._0_4_ = fVar177 * auVar194._0_4_ + fVar205 * auVar134._0_4_ + auVar193._0_4_ * fVar90;
  auVar266._4_4_ = fVar202 * auVar194._4_4_ + fVar229 * auVar134._4_4_ + auVar193._4_4_ * fVar150;
  auVar266._8_4_ = fVar203 * auVar194._8_4_ + fVar230 * auVar134._8_4_ + auVar193._8_4_ * fVar175;
  auVar266._12_4_ =
       fVar204 * auVar194._12_4_ + fVar231 * auVar134._12_4_ + auVar193._12_4_ * fVar176;
  auVar106 = vshufps_avx(auVar119,auVar119,0);
  auVar164 = vshufps_avx(auVar119,auVar119,0x55);
  auVar22 = vshufps_avx(auVar119,auVar119,0xaa);
  fVar90 = auVar22._0_4_;
  fVar150 = auVar22._4_4_;
  fVar175 = auVar22._8_4_;
  fVar176 = auVar22._12_4_;
  fVar205 = auVar164._0_4_;
  fVar229 = auVar164._4_4_;
  fVar230 = auVar164._8_4_;
  fVar231 = auVar164._12_4_;
  fVar177 = auVar106._0_4_;
  fVar202 = auVar106._4_4_;
  fVar203 = auVar106._8_4_;
  fVar204 = auVar106._12_4_;
  auVar151._0_4_ = fVar177 * auVar135._0_4_ + fVar205 * auVar126._0_4_ + fVar90 * auVar249._0_4_;
  auVar151._4_4_ = fVar202 * auVar135._4_4_ + fVar229 * auVar126._4_4_ + fVar150 * auVar249._4_4_;
  auVar151._8_4_ = fVar203 * auVar135._8_4_ + fVar230 * auVar126._8_4_ + fVar175 * auVar249._8_4_;
  auVar151._12_4_ =
       fVar204 * auVar135._12_4_ + fVar231 * auVar126._12_4_ + fVar176 * auVar249._12_4_;
  auVar120._0_4_ = fVar177 * auVar19._0_4_ + auVar21._0_4_ * fVar90 + fVar205 * auVar20._0_4_;
  auVar120._4_4_ = fVar202 * auVar19._4_4_ + auVar21._4_4_ * fVar150 + fVar229 * auVar20._4_4_;
  auVar120._8_4_ = fVar203 * auVar19._8_4_ + auVar21._8_4_ * fVar175 + fVar230 * auVar20._8_4_;
  auVar120._12_4_ = fVar204 * auVar19._12_4_ + auVar21._12_4_ * fVar176 + fVar231 * auVar20._12_4_;
  auVar91._0_4_ = fVar177 * auVar194._0_4_ + fVar205 * auVar134._0_4_ + auVar193._0_4_ * fVar90;
  auVar91._4_4_ = fVar202 * auVar194._4_4_ + fVar229 * auVar134._4_4_ + auVar193._4_4_ * fVar150;
  auVar91._8_4_ = fVar203 * auVar194._8_4_ + fVar230 * auVar134._8_4_ + auVar193._8_4_ * fVar175;
  auVar91._12_4_ = fVar204 * auVar194._12_4_ + fVar231 * auVar134._12_4_ + auVar193._12_4_ * fVar176
  ;
  auVar254._8_4_ = 0x7fffffff;
  auVar254._0_8_ = 0x7fffffff7fffffff;
  auVar254._12_4_ = 0x7fffffff;
  auVar135 = vandps_avx(auVar335,auVar254);
  auVar206._8_4_ = 0x219392ef;
  auVar206._0_8_ = 0x219392ef219392ef;
  auVar206._12_4_ = 0x219392ef;
  auVar135 = vcmpps_avx(auVar135,auVar206,1);
  auVar126 = vblendvps_avx(auVar335,auVar206,auVar135);
  auVar135 = vandps_avx(auVar346,auVar254);
  auVar135 = vcmpps_avx(auVar135,auVar206,1);
  auVar249 = vblendvps_avx(auVar346,auVar206,auVar135);
  auVar135 = vandps_avx(auVar266,auVar254);
  auVar135 = vcmpps_avx(auVar135,auVar206,1);
  auVar135 = vblendvps_avx(auVar266,auVar206,auVar135);
  auVar19 = vrcpps_avx(auVar126);
  fVar177 = auVar19._0_4_;
  auVar178._0_4_ = fVar177 * auVar126._0_4_;
  fVar202 = auVar19._4_4_;
  auVar178._4_4_ = fVar202 * auVar126._4_4_;
  fVar203 = auVar19._8_4_;
  auVar178._8_4_ = fVar203 * auVar126._8_4_;
  fVar204 = auVar19._12_4_;
  auVar178._12_4_ = fVar204 * auVar126._12_4_;
  auVar267._8_4_ = 0x3f800000;
  auVar267._0_8_ = &DAT_3f8000003f800000;
  auVar267._12_4_ = 0x3f800000;
  auVar126 = vsubps_avx(auVar267,auVar178);
  fVar177 = fVar177 + fVar177 * auVar126._0_4_;
  fVar202 = fVar202 + fVar202 * auVar126._4_4_;
  fVar203 = fVar203 + fVar203 * auVar126._8_4_;
  fVar204 = fVar204 + fVar204 * auVar126._12_4_;
  auVar126 = vrcpps_avx(auVar249);
  fVar205 = auVar126._0_4_;
  auVar234._0_4_ = fVar205 * auVar249._0_4_;
  fVar229 = auVar126._4_4_;
  auVar234._4_4_ = fVar229 * auVar249._4_4_;
  fVar230 = auVar126._8_4_;
  auVar234._8_4_ = fVar230 * auVar249._8_4_;
  fVar231 = auVar126._12_4_;
  auVar234._12_4_ = fVar231 * auVar249._12_4_;
  auVar126 = vsubps_avx(auVar267,auVar234);
  fVar205 = fVar205 + fVar205 * auVar126._0_4_;
  fVar229 = fVar229 + fVar229 * auVar126._4_4_;
  fVar230 = fVar230 + fVar230 * auVar126._8_4_;
  fVar231 = fVar231 + fVar231 * auVar126._12_4_;
  auVar126 = vrcpps_avx(auVar135);
  fVar233 = auVar126._0_4_;
  auVar255._0_4_ = fVar233 * auVar135._0_4_;
  fVar251 = auVar126._4_4_;
  auVar255._4_4_ = fVar251 * auVar135._4_4_;
  fVar252 = auVar126._8_4_;
  auVar255._8_4_ = fVar252 * auVar135._8_4_;
  fVar253 = auVar126._12_4_;
  auVar255._12_4_ = fVar253 * auVar135._12_4_;
  auVar135 = vsubps_avx(auVar267,auVar255);
  fVar233 = fVar233 + fVar233 * auVar135._0_4_;
  fVar251 = fVar251 + fVar251 * auVar135._4_4_;
  fVar252 = fVar252 + fVar252 * auVar135._8_4_;
  fVar253 = fVar253 + fVar253 * auVar135._12_4_;
  auVar135 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar82 + 0x16)) *
                           *(float *)(prim + lVar82 + 0x1a)));
  auVar249 = vshufps_avx(auVar135,auVar135,0);
  auVar135._8_8_ = 0;
  auVar135._0_8_ = *(ulong *)(prim + uVar81 * 7 + 6);
  auVar135 = vpmovsxwd_avx(auVar135);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar126._8_8_ = 0;
  auVar126._0_8_ = *(ulong *)(prim + uVar81 * 0xb + 6);
  auVar126 = vpmovsxwd_avx(auVar126);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,auVar135);
  fVar90 = auVar249._0_4_;
  fVar150 = auVar249._4_4_;
  fVar175 = auVar249._8_4_;
  fVar176 = auVar249._12_4_;
  auVar268._0_4_ = auVar126._0_4_ * fVar90 + auVar135._0_4_;
  auVar268._4_4_ = auVar126._4_4_ * fVar150 + auVar135._4_4_;
  auVar268._8_4_ = auVar126._8_4_ * fVar175 + auVar135._8_4_;
  auVar268._12_4_ = auVar126._12_4_ * fVar176 + auVar135._12_4_;
  auVar249._8_8_ = 0;
  auVar249._0_8_ = *(ulong *)(prim + uVar81 * 9 + 6);
  auVar135 = vpmovsxwd_avx(auVar249);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar81 * 0xd + 6);
  auVar126 = vpmovsxwd_avx(auVar19);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,auVar135);
  auVar277._0_4_ = auVar126._0_4_ * fVar90 + auVar135._0_4_;
  auVar277._4_4_ = auVar126._4_4_ * fVar150 + auVar135._4_4_;
  auVar277._8_4_ = auVar126._8_4_ * fVar175 + auVar135._8_4_;
  auVar277._12_4_ = auVar126._12_4_ * fVar176 + auVar135._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar81 * 0x12 + 6);
  auVar135 = vpmovsxwd_avx(auVar20);
  auVar135 = vcvtdq2ps_avx(auVar135);
  uVar85 = (ulong)(uint)((int)(uVar81 * 5) << 2);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar81 * 2 + uVar85 + 6);
  auVar126 = vpmovsxwd_avx(auVar21);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,auVar135);
  auVar299._0_4_ = auVar126._0_4_ * fVar90 + auVar135._0_4_;
  auVar299._4_4_ = auVar126._4_4_ * fVar150 + auVar135._4_4_;
  auVar299._8_4_ = auVar126._8_4_ * fVar175 + auVar135._8_4_;
  auVar299._12_4_ = auVar126._12_4_ * fVar176 + auVar135._12_4_;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = *(ulong *)(prim + uVar85 + 6);
  auVar135 = vpmovsxwd_avx(auVar194);
  auVar134._8_8_ = 0;
  auVar134._0_8_ = *(ulong *)(prim + uVar81 * 0x18 + 6);
  auVar126 = vpmovsxwd_avx(auVar134);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,auVar135);
  auVar313._0_4_ = auVar126._0_4_ * fVar90 + auVar135._0_4_;
  auVar313._4_4_ = auVar126._4_4_ * fVar150 + auVar135._4_4_;
  auVar313._8_4_ = auVar126._8_4_ * fVar175 + auVar135._8_4_;
  auVar313._12_4_ = auVar126._12_4_ * fVar176 + auVar135._12_4_;
  auVar193._8_8_ = 0;
  auVar193._0_8_ = *(ulong *)(prim + uVar81 * 0x1d + 6);
  auVar135 = vpmovsxwd_avx(auVar193);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar81 + (ulong)(byte)PVar12 * 0x20 + 6);
  auVar126 = vpmovsxwd_avx(auVar106);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar249 = vsubps_avx(auVar126,auVar135);
  auVar164._8_8_ = 0;
  auVar164._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar12 * 0x20 - uVar81) + 6);
  auVar126 = vpmovsxwd_avx(auVar164);
  auVar323._0_4_ = auVar249._0_4_ * fVar90 + auVar135._0_4_;
  auVar323._4_4_ = auVar249._4_4_ * fVar150 + auVar135._4_4_;
  auVar323._8_4_ = auVar249._8_4_ * fVar175 + auVar135._8_4_;
  auVar323._12_4_ = auVar249._12_4_ * fVar176 + auVar135._12_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar81 * 0x23 + 6);
  auVar249 = vpmovsxwd_avx(auVar22);
  auVar135 = vcvtdq2ps_avx(auVar126);
  auVar126 = vcvtdq2ps_avx(auVar249);
  auVar126 = vsubps_avx(auVar126,auVar135);
  auVar256._0_4_ = auVar135._0_4_ + auVar126._0_4_ * fVar90;
  auVar256._4_4_ = auVar135._4_4_ + auVar126._4_4_ * fVar150;
  auVar256._8_4_ = auVar135._8_4_ + auVar126._8_4_ * fVar175;
  auVar256._12_4_ = auVar135._12_4_ + auVar126._12_4_ * fVar176;
  auVar135 = vsubps_avx(auVar268,auVar151);
  auVar269._0_4_ = fVar177 * auVar135._0_4_;
  auVar269._4_4_ = fVar202 * auVar135._4_4_;
  auVar269._8_4_ = fVar203 * auVar135._8_4_;
  auVar269._12_4_ = fVar204 * auVar135._12_4_;
  auVar135 = vsubps_avx(auVar277,auVar151);
  auVar152._0_4_ = fVar177 * auVar135._0_4_;
  auVar152._4_4_ = fVar202 * auVar135._4_4_;
  auVar152._8_4_ = fVar203 * auVar135._8_4_;
  auVar152._12_4_ = fVar204 * auVar135._12_4_;
  auVar135 = vsubps_avx(auVar299,auVar120);
  auVar179._0_4_ = fVar205 * auVar135._0_4_;
  auVar179._4_4_ = fVar229 * auVar135._4_4_;
  auVar179._8_4_ = fVar230 * auVar135._8_4_;
  auVar179._12_4_ = fVar231 * auVar135._12_4_;
  auVar135 = vsubps_avx(auVar313,auVar120);
  auVar121._0_4_ = fVar205 * auVar135._0_4_;
  auVar121._4_4_ = fVar229 * auVar135._4_4_;
  auVar121._8_4_ = fVar230 * auVar135._8_4_;
  auVar121._12_4_ = fVar231 * auVar135._12_4_;
  auVar135 = vsubps_avx(auVar323,auVar91);
  auVar207._0_4_ = fVar233 * auVar135._0_4_;
  auVar207._4_4_ = fVar251 * auVar135._4_4_;
  auVar207._8_4_ = fVar252 * auVar135._8_4_;
  auVar207._12_4_ = fVar253 * auVar135._12_4_;
  auVar135 = vsubps_avx(auVar256,auVar91);
  auVar92._0_4_ = fVar233 * auVar135._0_4_;
  auVar92._4_4_ = fVar251 * auVar135._4_4_;
  auVar92._8_4_ = fVar252 * auVar135._8_4_;
  auVar92._12_4_ = fVar253 * auVar135._12_4_;
  auVar135 = vpminsd_avx(auVar269,auVar152);
  auVar126 = vpminsd_avx(auVar179,auVar121);
  auVar135 = vmaxps_avx(auVar135,auVar126);
  auVar126 = vpminsd_avx(auVar207,auVar92);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar278._4_4_ = uVar9;
  auVar278._0_4_ = uVar9;
  auVar278._8_4_ = uVar9;
  auVar278._12_4_ = uVar9;
  auVar126 = vmaxps_avx(auVar126,auVar278);
  auVar135 = vmaxps_avx(auVar135,auVar126);
  local_3f0._0_4_ = auVar135._0_4_ * 0.99999964;
  local_3f0._4_4_ = auVar135._4_4_ * 0.99999964;
  local_3f0._8_4_ = auVar135._8_4_ * 0.99999964;
  local_3f0._12_4_ = auVar135._12_4_ * 0.99999964;
  auVar135 = vpmaxsd_avx(auVar269,auVar152);
  auVar126 = vpmaxsd_avx(auVar179,auVar121);
  auVar135 = vminps_avx(auVar135,auVar126);
  auVar126 = vpmaxsd_avx(auVar207,auVar92);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar153._4_4_ = uVar9;
  auVar153._0_4_ = uVar9;
  auVar153._8_4_ = uVar9;
  auVar153._12_4_ = uVar9;
  auVar126 = vminps_avx(auVar126,auVar153);
  auVar135 = vminps_avx(auVar135,auVar126);
  auVar102._0_4_ = auVar135._0_4_ * 1.0000004;
  auVar102._4_4_ = auVar135._4_4_ * 1.0000004;
  auVar102._8_4_ = auVar135._8_4_ * 1.0000004;
  auVar102._12_4_ = auVar135._12_4_ * 1.0000004;
  auVar135 = vpshufd_avx(ZEXT116((byte)PVar12),0);
  auVar126 = vpcmpgtd_avx(auVar135,_DAT_01ff0cf0);
  auVar135 = vcmpps_avx(local_3f0,auVar102,2);
  auVar135 = vandps_avx(auVar135,auVar126);
  uVar78 = vmovmskps_avx(auVar135);
  local_711 = uVar78 != 0;
  if (uVar78 == 0) {
    return local_711;
  }
  uVar78 = uVar78 & 0xff;
  auVar109._16_16_ = mm_lookupmask_ps._240_16_;
  auVar109._0_16_ = mm_lookupmask_ps._240_16_;
  local_320 = vblendps_avx(auVar109,ZEXT832(0) << 0x20,0x80);
  uVar79 = 1 << ((byte)k & 0x1f);
  uVar81 = (ulong)((uVar79 & 0xf) << 4);
  lVar82 = (long)((int)uVar79 >> 4) * 0x10;
  auVar374 = ZEXT464(0) << 0x20;
LAB_01003831:
  lVar83 = 0;
  if (uVar78 != 0) {
    for (; (uVar78 >> lVar83 & 1) == 0; lVar83 = lVar83 + 1) {
    }
  }
  uVar79 = *(uint *)(prim + 2);
  pGVar13 = (context->scene->geometries).items[uVar79].ptr;
  fVar90 = (pGVar13->time_range).lower;
  fVar90 = pGVar13->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0xe0) - fVar90) / ((pGVar13->time_range).upper - fVar90));
  auVar135 = vroundss_avx(ZEXT416((uint)fVar90),ZEXT416((uint)fVar90),9);
  auVar135 = vminss_avx(auVar135,ZEXT416((uint)(pGVar13->fnumTimeSegments + -1.0)));
  auVar135 = vmaxss_avx(ZEXT816(0) << 0x20,auVar135);
  uVar85 = (ulong)*(uint *)(*(long *)&pGVar13->field_0x58 +
                           (ulong)*(uint *)(prim + lVar83 * 4 + 6) *
                           pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var14 = pGVar13[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar87 = (long)(int)auVar135._0_4_ * 0x38;
  lVar15 = *(long *)(_Var14 + lVar87);
  lVar16 = *(long *)(_Var14 + 0x10 + lVar87);
  pfVar4 = (float *)(lVar15 + lVar16 * uVar85);
  fVar150 = *pfVar4;
  fVar175 = pfVar4[1];
  fVar176 = pfVar4[2];
  fVar177 = pfVar4[3];
  lVar1 = uVar85 + 1;
  pfVar4 = (float *)(lVar15 + lVar16 * lVar1);
  lVar2 = uVar85 + 2;
  pfVar5 = (float *)(lVar15 + lVar16 * lVar2);
  lVar3 = uVar85 + 3;
  pfVar6 = (float *)(lVar15 + lVar16 * lVar3);
  fVar202 = *pfVar6;
  fVar203 = pfVar6[1];
  fVar204 = pfVar6[2];
  fVar205 = pfVar6[3];
  lVar15 = *(long *)&pGVar13[4].fnumTimeSegments;
  lVar16 = *(long *)(lVar15 + lVar87);
  lVar17 = *(long *)(lVar15 + 0x10 + lVar87);
  pfVar6 = (float *)(lVar16 + lVar17 * uVar85);
  fVar229 = *pfVar6;
  fVar230 = pfVar6[1];
  fVar231 = pfVar6[2];
  fVar233 = pfVar6[3];
  pfVar6 = (float *)(lVar16 + lVar17 * lVar1);
  pfVar7 = (float *)(lVar16 + lVar17 * lVar2);
  fVar90 = fVar90 - auVar135._0_4_;
  pfVar8 = (float *)(lVar16 + lVar17 * lVar3);
  fVar251 = *pfVar8;
  fVar252 = pfVar8[1];
  fVar253 = pfVar8[2];
  fVar232 = pfVar8[3];
  fVar322 = auVar374._8_4_;
  fVar330 = auVar374._12_4_;
  fVar298 = *pfVar5 * 0.0;
  fVar310 = pfVar5[1] * 0.0;
  fVar311 = fVar322 * pfVar5[2];
  fVar312 = fVar330 * pfVar5[3];
  fVar89 = fVar298 + fVar202 * 0.0;
  fVar115 = fVar310 + fVar203 * 0.0;
  fVar116 = fVar311 + fVar322 * fVar204;
  fVar117 = fVar312 + fVar330 * fVar205;
  fVar321 = *pfVar4 * 0.0;
  fVar329 = pfVar4[1] * 0.0;
  fVar331 = fVar322 * pfVar4[2];
  fVar333 = fVar330 * pfVar4[3];
  local_6d0._0_4_ = fVar150 + fVar321 + fVar89;
  local_6d0._4_4_ = fVar175 + fVar329 + fVar115;
  fStack_6c8 = fVar176 + fVar331 + fVar116;
  fStack_6c4 = fVar177 + fVar333 + fVar117;
  auVar93._0_4_ = *pfVar4 * 3.0 + fVar89;
  auVar93._4_4_ = pfVar4[1] * 3.0 + fVar115;
  auVar93._8_4_ = pfVar4[2] * 3.0 + fVar116;
  auVar93._12_4_ = pfVar4[3] * 3.0 + fVar117;
  auVar154._0_4_ = fVar150 * 3.0;
  auVar154._4_4_ = fVar175 * 3.0;
  auVar154._8_4_ = fVar176 * 3.0;
  auVar154._12_4_ = fVar177 * 3.0;
  auVar134 = vsubps_avx(auVar93,auVar154);
  fVar118 = *pfVar7 * 0.0;
  fVar147 = pfVar7[1] * 0.0;
  fVar148 = pfVar7[2] * fVar322;
  fVar149 = pfVar7[3] * fVar330;
  fVar89 = fVar118 + fVar251 * 0.0;
  fVar115 = fVar147 + fVar252 * 0.0;
  fVar116 = fVar148 + fVar253 * fVar322;
  fVar117 = fVar149 + fVar232 * fVar330;
  fVar345 = *pfVar6 * 0.0;
  fVar353 = pfVar6[1] * 0.0;
  fVar354 = fVar322 * pfVar6[2];
  fVar355 = fVar330 * pfVar6[3];
  auVar359._0_4_ = fVar345 + fVar89 + fVar229;
  auVar359._4_4_ = fVar353 + fVar115 + fVar230;
  auVar359._8_4_ = fVar354 + fVar116 + fVar231;
  auVar359._12_4_ = fVar355 + fVar117 + fVar233;
  auVar94._0_4_ = *pfVar6 * 3.0 + fVar89;
  auVar94._4_4_ = pfVar6[1] * 3.0 + fVar115;
  auVar94._8_4_ = pfVar6[2] * 3.0 + fVar116;
  auVar94._12_4_ = pfVar6[3] * 3.0 + fVar117;
  auVar257._0_4_ = fVar229 * 3.0;
  auVar257._4_4_ = fVar230 * 3.0;
  auVar257._8_4_ = fVar231 * 3.0;
  auVar257._12_4_ = fVar233 * 3.0;
  auVar19 = vsubps_avx(auVar94,auVar257);
  auVar180._0_4_ = fVar150 * 0.0;
  auVar180._4_4_ = fVar175 * 0.0;
  auVar180._8_4_ = fVar322 * fVar176;
  auVar180._12_4_ = fVar330 * fVar177;
  auVar258._0_4_ = auVar180._0_4_ + fVar321 + fVar298 + fVar202;
  auVar258._4_4_ = auVar180._4_4_ + fVar329 + fVar310 + fVar203;
  auVar258._8_4_ = auVar180._8_4_ + fVar331 + fVar311 + fVar204;
  auVar258._12_4_ = auVar180._12_4_ + fVar333 + fVar312 + fVar205;
  auVar270._0_4_ = fVar202 * 3.0;
  auVar270._4_4_ = fVar203 * 3.0;
  auVar270._8_4_ = fVar204 * 3.0;
  auVar270._12_4_ = fVar205 * 3.0;
  auVar208._0_4_ = *pfVar5 * 3.0;
  auVar208._4_4_ = pfVar5[1] * 3.0;
  auVar208._8_4_ = pfVar5[2] * 3.0;
  auVar208._12_4_ = pfVar5[3] * 3.0;
  auVar135 = vsubps_avx(auVar270,auVar208);
  auVar209._0_4_ = fVar321 + auVar135._0_4_;
  auVar209._4_4_ = fVar329 + auVar135._4_4_;
  auVar209._8_4_ = fVar331 + auVar135._8_4_;
  auVar209._12_4_ = fVar333 + auVar135._12_4_;
  auVar193 = vsubps_avx(auVar209,auVar180);
  auVar210._0_4_ = fVar229 * 0.0;
  auVar210._4_4_ = fVar230 * 0.0;
  auVar210._8_4_ = fVar322 * fVar231;
  auVar210._12_4_ = fVar330 * fVar233;
  auVar181._0_4_ = auVar210._0_4_ + fVar345 + fVar251 + fVar118;
  auVar181._4_4_ = auVar210._4_4_ + fVar353 + fVar252 + fVar147;
  auVar181._8_4_ = auVar210._8_4_ + fVar354 + fVar253 + fVar148;
  auVar181._12_4_ = auVar210._12_4_ + fVar355 + fVar232 + fVar149;
  auVar235._0_4_ = fVar251 * 3.0;
  auVar235._4_4_ = fVar252 * 3.0;
  auVar235._8_4_ = fVar253 * 3.0;
  auVar235._12_4_ = fVar232 * 3.0;
  auVar271._0_4_ = *pfVar7 * 3.0;
  auVar271._4_4_ = pfVar7[1] * 3.0;
  auVar271._8_4_ = pfVar7[2] * 3.0;
  auVar271._12_4_ = pfVar7[3] * 3.0;
  auVar135 = vsubps_avx(auVar235,auVar271);
  auVar236._0_4_ = fVar345 + auVar135._0_4_;
  auVar236._4_4_ = fVar353 + auVar135._4_4_;
  auVar236._8_4_ = fVar354 + auVar135._8_4_;
  auVar236._12_4_ = fVar355 + auVar135._12_4_;
  auVar21 = vsubps_avx(auVar236,auVar210);
  auVar135 = vshufps_avx(auVar134,auVar134,0xc9);
  auVar126 = vshufps_avx(auVar359,auVar359,0xc9);
  fVar89 = auVar134._0_4_;
  auVar237._0_4_ = fVar89 * auVar126._0_4_;
  fVar115 = auVar134._4_4_;
  auVar237._4_4_ = fVar115 * auVar126._4_4_;
  fVar116 = auVar134._8_4_;
  auVar237._8_4_ = fVar116 * auVar126._8_4_;
  fVar117 = auVar134._12_4_;
  auVar237._12_4_ = fVar117 * auVar126._12_4_;
  auVar279._0_4_ = auVar359._0_4_ * auVar135._0_4_;
  auVar279._4_4_ = auVar359._4_4_ * auVar135._4_4_;
  auVar279._8_4_ = auVar359._8_4_ * auVar135._8_4_;
  auVar279._12_4_ = auVar359._12_4_ * auVar135._12_4_;
  auVar126 = vsubps_avx(auVar279,auVar237);
  auVar249 = vshufps_avx(auVar126,auVar126,0xc9);
  auVar126 = vshufps_avx(auVar19,auVar19,0xc9);
  auVar280._0_4_ = auVar126._0_4_ * fVar89;
  auVar280._4_4_ = auVar126._4_4_ * fVar115;
  auVar280._8_4_ = auVar126._8_4_ * fVar116;
  auVar280._12_4_ = auVar126._12_4_ * fVar117;
  auVar95._0_4_ = auVar135._0_4_ * auVar19._0_4_;
  auVar95._4_4_ = auVar135._4_4_ * auVar19._4_4_;
  auVar95._8_4_ = auVar135._8_4_ * auVar19._8_4_;
  auVar95._12_4_ = auVar135._12_4_ * auVar19._12_4_;
  auVar135 = vsubps_avx(auVar95,auVar280);
  auVar19 = vshufps_avx(auVar135,auVar135,0xc9);
  auVar126 = vshufps_avx(auVar193,auVar193,0xc9);
  auVar135 = vshufps_avx(auVar181,auVar181,0xc9);
  fVar345 = auVar193._0_4_;
  auVar281._0_4_ = fVar345 * auVar135._0_4_;
  fVar353 = auVar193._4_4_;
  auVar281._4_4_ = fVar353 * auVar135._4_4_;
  fVar354 = auVar193._8_4_;
  auVar281._8_4_ = fVar354 * auVar135._8_4_;
  fVar355 = auVar193._12_4_;
  auVar281._12_4_ = fVar355 * auVar135._12_4_;
  auVar182._0_4_ = auVar126._0_4_ * auVar181._0_4_;
  auVar182._4_4_ = auVar126._4_4_ * auVar181._4_4_;
  auVar182._8_4_ = auVar126._8_4_ * auVar181._8_4_;
  auVar182._12_4_ = auVar126._12_4_ * auVar181._12_4_;
  auVar135 = vsubps_avx(auVar182,auVar281);
  auVar20 = vshufps_avx(auVar135,auVar135,0xc9);
  auVar135 = vshufps_avx(auVar21,auVar21,0xc9);
  auVar282._0_4_ = fVar345 * auVar135._0_4_;
  auVar282._4_4_ = fVar353 * auVar135._4_4_;
  auVar282._8_4_ = fVar354 * auVar135._8_4_;
  auVar282._12_4_ = fVar355 * auVar135._12_4_;
  auVar135 = vdpps_avx(auVar249,auVar249,0x7f);
  auVar211._0_4_ = auVar126._0_4_ * auVar21._0_4_;
  auVar211._4_4_ = auVar126._4_4_ * auVar21._4_4_;
  auVar211._8_4_ = auVar126._8_4_ * auVar21._8_4_;
  auVar211._12_4_ = auVar126._12_4_ * auVar21._12_4_;
  auVar126 = vsubps_avx(auVar211,auVar282);
  auVar21 = vshufps_avx(auVar126,auVar126,0xc9);
  fVar175 = auVar135._0_4_;
  auVar272._4_12_ = auVar374._4_12_;
  auVar272._0_4_ = fVar175;
  auVar126 = vrsqrtss_avx(auVar272,auVar272);
  fVar150 = auVar126._0_4_;
  auVar126 = ZEXT416((uint)(fVar150 * 1.5 - fVar175 * 0.5 * fVar150 * fVar150 * fVar150));
  auVar194 = vshufps_avx(auVar126,auVar126,0);
  auVar126 = vdpps_avx(auVar249,auVar19,0x7f);
  fVar251 = auVar194._0_4_ * auVar249._0_4_;
  fVar252 = auVar194._4_4_ * auVar249._4_4_;
  fVar253 = auVar194._8_4_ * auVar249._8_4_;
  fVar232 = auVar194._12_4_ * auVar249._12_4_;
  auVar135 = vshufps_avx(auVar135,auVar135,0);
  auVar96._0_4_ = auVar135._0_4_ * auVar19._0_4_;
  auVar96._4_4_ = auVar135._4_4_ * auVar19._4_4_;
  auVar96._8_4_ = auVar135._8_4_ * auVar19._8_4_;
  auVar96._12_4_ = auVar135._12_4_ * auVar19._12_4_;
  auVar135 = vshufps_avx(auVar126,auVar126,0);
  auVar238._0_4_ = auVar135._0_4_ * auVar249._0_4_;
  auVar238._4_4_ = auVar135._4_4_ * auVar249._4_4_;
  auVar238._8_4_ = auVar135._8_4_ * auVar249._8_4_;
  auVar238._12_4_ = auVar135._12_4_ * auVar249._12_4_;
  auVar106 = vsubps_avx(auVar96,auVar238);
  auVar135 = vrcpss_avx(auVar272,auVar272);
  auVar135 = ZEXT416((uint)(auVar135._0_4_ * (2.0 - fVar175 * auVar135._0_4_)));
  auVar249 = vshufps_avx(auVar135,auVar135,0);
  auVar135 = vdpps_avx(auVar20,auVar20,0x7f);
  fVar118 = auVar135._0_4_;
  auVar283._4_12_ = auVar374._4_12_;
  auVar283._0_4_ = fVar118;
  auVar126 = vrsqrtss_avx(auVar283,auVar283);
  fVar229 = auVar126._0_4_;
  auVar126 = vdpps_avx(auVar20,auVar21,0x7f);
  auVar135 = vshufps_avx(auVar135,auVar135,0);
  auVar369._0_4_ = auVar21._0_4_ * auVar135._0_4_;
  auVar369._4_4_ = auVar21._4_4_ * auVar135._4_4_;
  auVar369._8_4_ = auVar21._8_4_ * auVar135._8_4_;
  auVar369._12_4_ = auVar21._12_4_ * auVar135._12_4_;
  lVar16 = *(long *)(_Var14 + 0x38 + lVar87);
  lVar17 = *(long *)(_Var14 + 0x48 + lVar87);
  pfVar4 = (float *)(lVar16 + lVar17 * uVar85);
  fVar150 = *pfVar4;
  fVar175 = pfVar4[1];
  fVar176 = pfVar4[2];
  fVar177 = pfVar4[3];
  pfVar4 = (float *)(lVar16 + lVar17 * lVar1);
  pfVar5 = (float *)(lVar16 + lVar17 * lVar2);
  auVar135 = vshufps_avx(auVar126,auVar126,0);
  auVar97._0_4_ = auVar20._0_4_ * auVar135._0_4_;
  auVar97._4_4_ = auVar20._4_4_ * auVar135._4_4_;
  auVar97._8_4_ = auVar20._8_4_ * auVar135._8_4_;
  auVar97._12_4_ = auVar20._12_4_ * auVar135._12_4_;
  auVar21 = vsubps_avx(auVar369,auVar97);
  pfVar6 = (float *)(lVar16 + lVar17 * lVar3);
  fVar202 = *pfVar6;
  fVar203 = pfVar6[1];
  fVar204 = pfVar6[2];
  fVar205 = pfVar6[3];
  auVar135 = ZEXT416((uint)(fVar229 * 1.5 - fVar118 * 0.5 * fVar229 * fVar229 * fVar229));
  auVar126 = vshufps_avx(auVar135,auVar135,0);
  fVar229 = auVar126._0_4_ * auVar20._0_4_;
  fVar230 = auVar126._4_4_ * auVar20._4_4_;
  fVar231 = auVar126._8_4_ * auVar20._8_4_;
  fVar233 = auVar126._12_4_ * auVar20._12_4_;
  auVar135 = vrcpss_avx(auVar283,auVar283);
  auVar135 = ZEXT416((uint)(auVar135._0_4_ * (2.0 - auVar135._0_4_ * fVar118)));
  auVar135 = vshufps_avx(auVar135,auVar135,0);
  auVar19 = vshufps_avx(_local_6d0,_local_6d0,0xff);
  auVar360._0_4_ = auVar19._0_4_ * fVar251;
  auVar360._4_4_ = auVar19._4_4_ * fVar252;
  auVar360._8_4_ = auVar19._8_4_ * fVar253;
  auVar360._12_4_ = auVar19._12_4_ * fVar232;
  auVar20 = vshufps_avx(auVar134,auVar134,0xff);
  auVar164 = vsubps_avx(_local_6d0,auVar360);
  auVar273._0_4_ =
       auVar20._0_4_ * fVar251 + auVar19._0_4_ * auVar194._0_4_ * auVar106._0_4_ * auVar249._0_4_;
  auVar273._4_4_ =
       auVar20._4_4_ * fVar252 + auVar19._4_4_ * auVar194._4_4_ * auVar106._4_4_ * auVar249._4_4_;
  auVar273._8_4_ =
       auVar20._8_4_ * fVar253 + auVar19._8_4_ * auVar194._8_4_ * auVar106._8_4_ * auVar249._8_4_;
  auVar273._12_4_ =
       auVar20._12_4_ * fVar232 +
       auVar19._12_4_ * auVar194._12_4_ * auVar106._12_4_ * auVar249._12_4_;
  auVar194 = vsubps_avx(auVar134,auVar273);
  local_6d0._0_4_ = (float)local_6d0._0_4_ + auVar360._0_4_;
  local_6d0._4_4_ = (float)local_6d0._4_4_ + auVar360._4_4_;
  fStack_6c8 = fStack_6c8 + auVar360._8_4_;
  fStack_6c4 = fStack_6c4 + auVar360._12_4_;
  auVar249 = vshufps_avx(auVar258,auVar258,0xff);
  auVar155._0_4_ = auVar249._0_4_ * fVar229;
  auVar155._4_4_ = auVar249._4_4_ * fVar230;
  auVar155._8_4_ = auVar249._8_4_ * fVar231;
  auVar155._12_4_ = auVar249._12_4_ * fVar233;
  auVar19 = vshufps_avx(auVar193,auVar193,0xff);
  auVar134 = vsubps_avx(auVar258,auVar155);
  auVar98._0_4_ =
       auVar19._0_4_ * fVar229 + auVar249._0_4_ * auVar126._0_4_ * auVar21._0_4_ * auVar135._0_4_;
  auVar98._4_4_ =
       auVar19._4_4_ * fVar230 + auVar249._4_4_ * auVar126._4_4_ * auVar21._4_4_ * auVar135._4_4_;
  auVar98._8_4_ =
       auVar19._8_4_ * fVar231 + auVar249._8_4_ * auVar126._8_4_ * auVar21._8_4_ * auVar135._8_4_;
  auVar98._12_4_ =
       auVar19._12_4_ * fVar233 +
       auVar249._12_4_ * auVar126._12_4_ * auVar21._12_4_ * auVar135._12_4_;
  auVar193 = vsubps_avx(auVar193,auVar98);
  local_640._4_4_ = auVar258._4_4_ + auVar155._4_4_;
  local_640._0_4_ = auVar258._0_4_ + auVar155._0_4_;
  fStack_638 = auVar258._8_4_ + auVar155._8_4_;
  fStack_634 = auVar258._12_4_ + auVar155._12_4_;
  fVar298 = *pfVar5 * 0.0;
  fVar310 = pfVar5[1] * 0.0;
  fVar311 = pfVar5[2] * 0.0;
  fVar312 = pfVar5[3] * 0.0;
  fVar368 = fVar298 + fVar202 * 0.0;
  fVar375 = fVar310 + fVar203 * 0.0;
  fVar376 = fVar311 + fVar204 * 0.0;
  fVar377 = fVar312 + fVar205 * 0.0;
  auVar99._0_4_ = fVar368 + *pfVar4 * 3.0;
  auVar99._4_4_ = fVar375 + pfVar4[1] * 3.0;
  auVar99._8_4_ = fVar376 + pfVar4[2] * 3.0;
  auVar99._12_4_ = fVar377 + pfVar4[3] * 3.0;
  auVar156._0_4_ = fVar150 * 3.0;
  auVar156._4_4_ = fVar175 * 3.0;
  auVar156._8_4_ = fVar176 * 3.0;
  auVar156._12_4_ = fVar177 * 3.0;
  auVar106 = vsubps_avx(auVar99,auVar156);
  lVar16 = *(long *)(lVar15 + 0x38 + lVar87);
  lVar15 = *(long *)(lVar15 + 0x48 + lVar87);
  auVar135 = *(undefined1 (*) [16])(lVar16 + lVar2 * lVar15);
  pfVar6 = (float *)(lVar16 + lVar15 * lVar3);
  fVar229 = *pfVar6;
  fVar230 = pfVar6[1];
  fVar231 = pfVar6[2];
  fVar233 = pfVar6[3];
  fVar118 = auVar135._0_4_ * 0.0;
  fVar147 = auVar135._4_4_ * 0.0;
  fVar148 = auVar135._8_4_ * 0.0;
  fVar149 = auVar135._12_4_ * 0.0;
  fVar321 = fVar118 + fVar229 * 0.0;
  fVar329 = fVar147 + fVar230 * 0.0;
  fVar331 = fVar148 + fVar231 * 0.0;
  fVar333 = fVar149 + fVar233 * 0.0;
  pfVar6 = (float *)(lVar16 + lVar1 * lVar15);
  auVar361._0_4_ = *pfVar6 * 3.0 + fVar321;
  auVar361._4_4_ = pfVar6[1] * 3.0 + fVar329;
  auVar361._8_4_ = pfVar6[2] * 3.0 + fVar331;
  auVar361._12_4_ = pfVar6[3] * 3.0 + fVar333;
  pfVar7 = (float *)(lVar16 + uVar85 * lVar15);
  fVar251 = *pfVar7;
  fVar252 = pfVar7[1];
  fVar253 = pfVar7[2];
  fVar232 = pfVar7[3];
  auVar284._0_4_ = fVar251 * 3.0;
  auVar284._4_4_ = fVar252 * 3.0;
  auVar284._8_4_ = fVar253 * 3.0;
  auVar284._12_4_ = fVar232 * 3.0;
  auVar126 = vsubps_avx(auVar361,auVar284);
  auVar285._0_4_ = fVar202 * 3.0;
  auVar285._4_4_ = fVar203 * 3.0;
  auVar285._8_4_ = fVar204 * 3.0;
  auVar285._12_4_ = fVar205 * 3.0;
  auVar336._0_4_ = *pfVar5 * 3.0;
  auVar336._4_4_ = pfVar5[1] * 3.0;
  auVar336._8_4_ = pfVar5[2] * 3.0;
  auVar336._12_4_ = pfVar5[3] * 3.0;
  auVar249 = vsubps_avx(auVar285,auVar336);
  fVar322 = *pfVar4 * 0.0;
  fVar330 = pfVar4[1] * 0.0;
  fVar332 = pfVar4[2] * 0.0;
  fVar334 = pfVar4[3] * 0.0;
  auVar286._0_4_ = fVar322 + auVar249._0_4_;
  auVar286._4_4_ = fVar330 + auVar249._4_4_;
  auVar286._8_4_ = fVar332 + auVar249._8_4_;
  auVar286._12_4_ = fVar334 + auVar249._12_4_;
  auVar337._0_4_ = fVar150 + fVar322 + fVar368;
  auVar337._4_4_ = fVar175 + fVar330 + fVar375;
  auVar337._8_4_ = fVar176 + fVar332 + fVar376;
  auVar337._12_4_ = fVar177 + fVar334 + fVar377;
  auVar314._0_4_ = fVar150 * 0.0;
  auVar314._4_4_ = fVar175 * 0.0;
  auVar314._8_4_ = fVar176 * 0.0;
  auVar314._12_4_ = fVar177 * 0.0;
  local_680._0_4_ = auVar314._0_4_ + fVar322 + fVar202 + fVar298;
  local_680._4_4_ = auVar314._4_4_ + fVar330 + fVar203 + fVar310;
  fStack_678 = auVar314._8_4_ + fVar332 + fVar204 + fVar311;
  fStack_674 = auVar314._12_4_ + fVar334 + fVar205 + fVar312;
  auVar22 = vsubps_avx(auVar286,auVar314);
  auVar122._0_4_ = fVar229 * 3.0;
  auVar122._4_4_ = fVar230 * 3.0;
  auVar122._8_4_ = fVar231 * 3.0;
  auVar122._12_4_ = fVar233 * 3.0;
  auVar212._0_4_ = auVar135._0_4_ * 3.0;
  auVar212._4_4_ = auVar135._4_4_ * 3.0;
  auVar212._8_4_ = auVar135._8_4_ * 3.0;
  auVar212._12_4_ = auVar135._12_4_ * 3.0;
  auVar135 = vsubps_avx(auVar122,auVar212);
  fVar150 = *pfVar6 * 0.0;
  fVar175 = pfVar6[1] * 0.0;
  fVar176 = pfVar6[2] * 0.0;
  fVar177 = pfVar6[3] * 0.0;
  auVar123._0_4_ = fVar150 + auVar135._0_4_;
  auVar123._4_4_ = fVar175 + auVar135._4_4_;
  auVar123._8_4_ = fVar176 + auVar135._8_4_;
  auVar123._12_4_ = fVar177 + auVar135._12_4_;
  auVar157._0_4_ = fVar251 + fVar150 + fVar321;
  auVar157._4_4_ = fVar252 + fVar175 + fVar329;
  auVar157._8_4_ = fVar253 + fVar176 + fVar331;
  auVar157._12_4_ = fVar232 + fVar177 + fVar333;
  auVar100._0_4_ = fVar251 * 0.0;
  auVar100._4_4_ = fVar252 * 0.0;
  auVar100._8_4_ = fVar253 * 0.0;
  auVar100._12_4_ = fVar232 * 0.0;
  auVar183._0_4_ = auVar100._0_4_ + fVar150 + fVar118 + fVar229;
  auVar183._4_4_ = auVar100._4_4_ + fVar175 + fVar147 + fVar230;
  auVar183._8_4_ = auVar100._8_4_ + fVar176 + fVar148 + fVar231;
  auVar183._12_4_ = auVar100._12_4_ + fVar177 + fVar149 + fVar233;
  auVar19 = vsubps_avx(auVar123,auVar100);
  auVar135 = vshufps_avx(auVar157,auVar157,0xc9);
  fVar205 = auVar106._0_4_;
  auVar124._0_4_ = fVar205 * auVar135._0_4_;
  fVar229 = auVar106._4_4_;
  auVar124._4_4_ = fVar229 * auVar135._4_4_;
  fVar230 = auVar106._8_4_;
  auVar124._8_4_ = fVar230 * auVar135._8_4_;
  fVar231 = auVar106._12_4_;
  auVar124._12_4_ = fVar231 * auVar135._12_4_;
  auVar135 = vshufps_avx(auVar106,auVar106,0xc9);
  auVar158._0_4_ = auVar135._0_4_ * auVar157._0_4_;
  auVar158._4_4_ = auVar135._4_4_ * auVar157._4_4_;
  auVar158._8_4_ = auVar135._8_4_ * auVar157._8_4_;
  auVar158._12_4_ = auVar135._12_4_ * auVar157._12_4_;
  auVar249 = vsubps_avx(auVar158,auVar124);
  auVar159._0_4_ = auVar126._0_4_ * auVar135._0_4_;
  auVar159._4_4_ = auVar126._4_4_ * auVar135._4_4_;
  auVar159._8_4_ = auVar126._8_4_ * auVar135._8_4_;
  auVar159._12_4_ = auVar126._12_4_ * auVar135._12_4_;
  auVar135 = vshufps_avx(auVar126,auVar126,0xc9);
  auVar213._0_4_ = fVar205 * auVar135._0_4_;
  auVar213._4_4_ = fVar229 * auVar135._4_4_;
  auVar213._8_4_ = fVar230 * auVar135._8_4_;
  auVar213._12_4_ = fVar231 * auVar135._12_4_;
  auVar20 = vsubps_avx(auVar159,auVar213);
  auVar135 = vshufps_avx(auVar183,auVar183,0xc9);
  fVar233 = auVar22._0_4_;
  auVar214._0_4_ = fVar233 * auVar135._0_4_;
  fVar251 = auVar22._4_4_;
  auVar214._4_4_ = fVar251 * auVar135._4_4_;
  fVar252 = auVar22._8_4_;
  auVar214._8_4_ = fVar252 * auVar135._8_4_;
  fVar253 = auVar22._12_4_;
  auVar214._12_4_ = fVar253 * auVar135._12_4_;
  auVar135 = vshufps_avx(auVar22,auVar22,0xc9);
  auVar184._0_4_ = auVar135._0_4_ * auVar183._0_4_;
  auVar184._4_4_ = auVar135._4_4_ * auVar183._4_4_;
  auVar184._8_4_ = auVar135._8_4_ * auVar183._8_4_;
  auVar184._12_4_ = auVar135._12_4_ * auVar183._12_4_;
  auVar21 = vsubps_avx(auVar184,auVar214);
  auVar249 = vshufps_avx(auVar249,auVar249,0xc9);
  auVar125._0_4_ = auVar135._0_4_ * auVar19._0_4_;
  auVar125._4_4_ = auVar135._4_4_ * auVar19._4_4_;
  auVar125._8_4_ = auVar135._8_4_ * auVar19._8_4_;
  auVar125._12_4_ = auVar135._12_4_ * auVar19._12_4_;
  auVar135 = vdpps_avx(auVar249,auVar249,0x7f);
  auVar126 = vshufps_avx(auVar19,auVar19,0xc9);
  auVar101._0_4_ = fVar233 * auVar126._0_4_;
  auVar101._4_4_ = fVar251 * auVar126._4_4_;
  auVar101._8_4_ = fVar252 * auVar126._8_4_;
  auVar101._12_4_ = fVar253 * auVar126._12_4_;
  auVar91 = vsubps_avx(auVar125,auVar101);
  fVar175 = auVar135._0_4_;
  auVar102 = ZEXT416((uint)fVar175);
  auVar126 = vrsqrtss_avx(auVar102,auVar102);
  fVar150 = auVar126._0_4_;
  auVar19 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar126 = vdpps_avx(auVar249,auVar19,0x7f);
  auVar135 = vshufps_avx(auVar135,auVar135,0);
  auVar160._0_4_ = auVar135._0_4_ * auVar19._0_4_;
  auVar160._4_4_ = auVar135._4_4_ * auVar19._4_4_;
  auVar160._8_4_ = auVar135._8_4_ * auVar19._8_4_;
  auVar160._12_4_ = auVar135._12_4_ * auVar19._12_4_;
  auVar135 = vshufps_avx(auVar126,auVar126,0);
  auVar215._0_4_ = auVar249._0_4_ * auVar135._0_4_;
  auVar215._4_4_ = auVar249._4_4_ * auVar135._4_4_;
  auVar215._8_4_ = auVar249._8_4_ * auVar135._8_4_;
  auVar215._12_4_ = auVar249._12_4_ * auVar135._12_4_;
  auVar92 = vsubps_avx(auVar160,auVar215);
  auVar135 = vrcpss_avx(auVar102,auVar102);
  auVar135 = ZEXT416((uint)(auVar135._0_4_ * (2.0 - fVar175 * auVar135._0_4_)));
  auVar19 = vshufps_avx(auVar135,auVar135,0);
  auVar20 = vshufps_avx(auVar21,auVar21,0xc9);
  auVar135 = vdpps_avx(auVar20,auVar20,0x7f);
  auVar126 = ZEXT416((uint)(fVar150 * 1.5 - fVar175 * 0.5 * fVar150 * fVar150 * fVar150));
  auVar21 = vshufps_avx(auVar126,auVar126,0);
  fVar202 = auVar249._0_4_ * auVar21._0_4_;
  fVar203 = auVar249._4_4_ * auVar21._4_4_;
  fVar204 = auVar249._8_4_ * auVar21._8_4_;
  fVar232 = auVar249._12_4_ * auVar21._12_4_;
  fVar175 = auVar135._0_4_;
  auVar102 = ZEXT416((uint)fVar175);
  auVar126 = vrsqrtss_avx(auVar102,auVar102);
  fVar150 = auVar126._0_4_;
  auVar249 = vshufps_avx(auVar91,auVar91,0xc9);
  auVar126 = vdpps_avx(auVar20,auVar249,0x7f);
  auVar135 = vshufps_avx(auVar135,auVar135,0);
  auVar216._0_4_ = auVar135._0_4_ * auVar249._0_4_;
  auVar216._4_4_ = auVar135._4_4_ * auVar249._4_4_;
  auVar216._8_4_ = auVar135._8_4_ * auVar249._8_4_;
  auVar216._12_4_ = auVar135._12_4_ * auVar249._12_4_;
  auVar135 = vshufps_avx(auVar126,auVar126,0);
  auVar239._0_4_ = auVar20._0_4_ * auVar135._0_4_;
  auVar239._4_4_ = auVar20._4_4_ * auVar135._4_4_;
  auVar239._8_4_ = auVar20._8_4_ * auVar135._8_4_;
  auVar239._12_4_ = auVar20._12_4_ * auVar135._12_4_;
  auVar91 = vsubps_avx(auVar216,auVar239);
  auVar135 = vrcpss_avx(auVar102,auVar102);
  auVar135 = ZEXT416((uint)(auVar135._0_4_ * (2.0 - fVar175 * auVar135._0_4_)));
  auVar135 = vshufps_avx(auVar135,auVar135,0);
  auVar126 = ZEXT416((uint)(fVar150 * 1.5 - fVar175 * 0.5 * fVar150 * fVar150 * fVar150));
  auVar126 = vshufps_avx(auVar126,auVar126,0);
  fVar150 = auVar20._0_4_ * auVar126._0_4_;
  fVar175 = auVar20._4_4_ * auVar126._4_4_;
  fVar176 = auVar20._8_4_ * auVar126._8_4_;
  fVar177 = auVar20._12_4_ * auVar126._12_4_;
  auVar249 = vshufps_avx(auVar106,auVar106,0xff);
  auVar20 = vshufps_avx(auVar337,auVar337,0xff);
  auVar217._0_4_ = fVar202 * auVar20._0_4_;
  auVar217._4_4_ = fVar203 * auVar20._4_4_;
  auVar217._8_4_ = fVar204 * auVar20._8_4_;
  auVar217._12_4_ = fVar232 * auVar20._12_4_;
  auVar127._0_4_ =
       fVar202 * auVar249._0_4_ + auVar21._0_4_ * auVar92._0_4_ * auVar19._0_4_ * auVar20._0_4_;
  auVar127._4_4_ =
       fVar203 * auVar249._4_4_ + auVar21._4_4_ * auVar92._4_4_ * auVar19._4_4_ * auVar20._4_4_;
  auVar127._8_4_ =
       fVar204 * auVar249._8_4_ + auVar21._8_4_ * auVar92._8_4_ * auVar19._8_4_ * auVar20._8_4_;
  auVar127._12_4_ =
       fVar232 * auVar249._12_4_ + auVar21._12_4_ * auVar92._12_4_ * auVar19._12_4_ * auVar20._12_4_
  ;
  auVar20 = vsubps_avx(auVar337,auVar217);
  auVar21 = vsubps_avx(auVar106,auVar127);
  auVar249 = vshufps_avx(auVar22,auVar22,0xff);
  auVar19 = vshufps_avx(_local_680,_local_680,0xff);
  auVar161._0_4_ = auVar19._0_4_ * fVar150;
  auVar161._4_4_ = auVar19._4_4_ * fVar175;
  auVar161._8_4_ = auVar19._8_4_ * fVar176;
  auVar161._12_4_ = auVar19._12_4_ * fVar177;
  auVar103._0_4_ =
       auVar249._0_4_ * fVar150 + auVar19._0_4_ * auVar126._0_4_ * auVar91._0_4_ * auVar135._0_4_;
  auVar103._4_4_ =
       auVar249._4_4_ * fVar175 + auVar19._4_4_ * auVar126._4_4_ * auVar91._4_4_ * auVar135._4_4_;
  auVar103._8_4_ =
       auVar249._8_4_ * fVar176 + auVar19._8_4_ * auVar126._8_4_ * auVar91._8_4_ * auVar135._8_4_;
  auVar103._12_4_ =
       auVar249._12_4_ * fVar177 +
       auVar19._12_4_ * auVar126._12_4_ * auVar91._12_4_ * auVar135._12_4_;
  auVar249 = vsubps_avx(_local_680,auVar161);
  auVar347._0_4_ = (float)local_680._0_4_ + auVar161._0_4_;
  auVar347._4_4_ = (float)local_680._4_4_ + auVar161._4_4_;
  auVar347._8_4_ = fStack_678 + auVar161._8_4_;
  auVar347._12_4_ = fStack_674 + auVar161._12_4_;
  auVar19 = vsubps_avx(auVar22,auVar103);
  local_660 = auVar194._0_4_;
  fStack_65c = auVar194._4_4_;
  fStack_658 = auVar194._8_4_;
  fStack_654 = auVar194._12_4_;
  local_6a0 = auVar164._0_4_;
  fStack_69c = auVar164._4_4_;
  fStack_698 = auVar164._8_4_;
  fStack_694 = auVar164._12_4_;
  auVar135 = vshufps_avx(ZEXT416((uint)fVar90),ZEXT416((uint)fVar90),0);
  auVar126 = vshufps_avx(ZEXT416((uint)(1.0 - fVar90)),ZEXT416((uint)(1.0 - fVar90)),0);
  fVar177 = auVar135._0_4_;
  fVar202 = auVar135._4_4_;
  fVar203 = auVar135._8_4_;
  fVar204 = auVar135._12_4_;
  fVar90 = auVar126._0_4_;
  fVar150 = auVar126._4_4_;
  fVar175 = auVar126._8_4_;
  fVar176 = auVar126._12_4_;
  local_4a0._0_4_ = fVar90 * local_6a0 + fVar177 * auVar20._0_4_;
  local_4a0._4_4_ = fVar150 * fStack_69c + fVar202 * auVar20._4_4_;
  fStack_498 = fVar175 * fStack_698 + fVar203 * auVar20._8_4_;
  fStack_494 = fVar176 * fStack_694 + fVar204 * auVar20._12_4_;
  fVar232 = fVar90 * (local_6a0 + local_660 * 0.33333334) +
            fVar177 * (auVar20._0_4_ + auVar21._0_4_ * 0.33333334);
  fVar118 = fVar150 * (fStack_69c + fStack_65c * 0.33333334) +
            fVar202 * (auVar20._4_4_ + auVar21._4_4_ * 0.33333334);
  fVar147 = fVar175 * (fStack_698 + fStack_658 * 0.33333334) +
            fVar203 * (auVar20._8_4_ + auVar21._8_4_ * 0.33333334);
  fVar148 = fVar176 * (fStack_694 + fStack_654 * 0.33333334) +
            fVar204 * (auVar20._12_4_ + auVar21._12_4_ * 0.33333334);
  local_5f0 = auVar193._0_4_;
  fStack_5ec = auVar193._4_4_;
  fStack_5e8 = auVar193._8_4_;
  fStack_5e4 = auVar193._12_4_;
  auVar185._0_4_ = local_5f0 * 0.33333334;
  auVar185._4_4_ = fStack_5ec * 0.33333334;
  auVar185._8_4_ = fStack_5e8 * 0.33333334;
  auVar185._12_4_ = fStack_5e4 * 0.33333334;
  auVar135 = vsubps_avx(auVar134,auVar185);
  auVar240._0_4_ = (fVar345 + auVar98._0_4_) * 0.33333334;
  auVar240._4_4_ = (fVar353 + auVar98._4_4_) * 0.33333334;
  auVar240._8_4_ = (fVar354 + auVar98._8_4_) * 0.33333334;
  auVar240._12_4_ = (fVar355 + auVar98._12_4_) * 0.33333334;
  auVar126 = vsubps_avx(_local_640,auVar240);
  auVar162._0_4_ = auVar19._0_4_ * 0.33333334;
  auVar162._4_4_ = auVar19._4_4_ * 0.33333334;
  auVar162._8_4_ = auVar19._8_4_ * 0.33333334;
  auVar162._12_4_ = auVar19._12_4_ * 0.33333334;
  auVar19 = vsubps_avx(auVar249,auVar162);
  auVar128._0_4_ = (fVar233 + auVar103._0_4_) * 0.33333334;
  auVar128._4_4_ = (fVar251 + auVar103._4_4_) * 0.33333334;
  auVar128._8_4_ = (fVar252 + auVar103._8_4_) * 0.33333334;
  auVar128._12_4_ = (fVar253 + auVar103._12_4_) * 0.33333334;
  auVar20 = vsubps_avx(auVar347,auVar128);
  local_4b0._0_4_ = fVar90 * auVar135._0_4_ + fVar177 * auVar19._0_4_;
  local_4b0._4_4_ = fVar150 * auVar135._4_4_ + fVar202 * auVar19._4_4_;
  fStack_4a8 = fVar175 * auVar135._8_4_ + fVar203 * auVar19._8_4_;
  fStack_4a4 = fVar176 * auVar135._12_4_ + fVar204 * auVar19._12_4_;
  local_4c0._0_4_ = fVar177 * auVar249._0_4_ + auVar134._0_4_ * fVar90;
  local_4c0._4_4_ = fVar202 * auVar249._4_4_ + auVar134._4_4_ * fVar150;
  fStack_4b8 = fVar203 * auVar249._8_4_ + auVar134._8_4_ * fVar175;
  fStack_4b4 = fVar204 * auVar249._12_4_ + auVar134._12_4_ * fVar176;
  local_4d0._0_4_ = (float)local_6d0._0_4_ * fVar90 + fVar177 * (auVar337._0_4_ + auVar217._0_4_);
  local_4d0._4_4_ = (float)local_6d0._4_4_ * fVar150 + fVar202 * (auVar337._4_4_ + auVar217._4_4_);
  fStack_4c8 = fStack_6c8 * fVar175 + fVar203 * (auVar337._8_4_ + auVar217._8_4_);
  fStack_4c4 = fStack_6c4 * fVar176 + fVar204 * (auVar337._12_4_ + auVar217._12_4_);
  local_4e0._0_4_ =
       ((float)local_6d0._0_4_ + (fVar89 + auVar273._0_4_) * 0.33333334) * fVar90 +
       fVar177 * (auVar337._0_4_ + auVar217._0_4_ + (fVar205 + auVar127._0_4_) * 0.33333334);
  local_4e0._4_4_ =
       ((float)local_6d0._4_4_ + (fVar115 + auVar273._4_4_) * 0.33333334) * fVar150 +
       fVar202 * (auVar337._4_4_ + auVar217._4_4_ + (fVar229 + auVar127._4_4_) * 0.33333334);
  fStack_4d8 = (fStack_6c8 + (fVar116 + auVar273._8_4_) * 0.33333334) * fVar175 +
               fVar203 * (auVar337._8_4_ + auVar217._8_4_ + (fVar230 + auVar127._8_4_) * 0.33333334)
  ;
  fStack_4d4 = (fStack_6c4 + (fVar117 + auVar273._12_4_) * 0.33333334) * fVar176 +
               fVar204 * (auVar337._12_4_ + auVar217._12_4_ +
                         (fVar231 + auVar127._12_4_) * 0.33333334);
  local_4f0._0_4_ = fVar90 * auVar126._0_4_ + fVar177 * auVar20._0_4_;
  local_4f0._4_4_ = fVar150 * auVar126._4_4_ + fVar202 * auVar20._4_4_;
  fStack_4e8 = fVar175 * auVar126._8_4_ + fVar203 * auVar20._8_4_;
  fStack_4e4 = fVar176 * auVar126._12_4_ + fVar204 * auVar20._12_4_;
  fVar233 = fVar90 * (auVar258._0_4_ + auVar155._0_4_) + fVar177 * auVar347._0_4_;
  fVar251 = fVar150 * (auVar258._4_4_ + auVar155._4_4_) + fVar202 * auVar347._4_4_;
  fVar252 = fVar175 * (auVar258._8_4_ + auVar155._8_4_) + fVar203 * auVar347._8_4_;
  fVar253 = fVar176 * (auVar258._12_4_ + auVar155._12_4_) + fVar204 * auVar347._12_4_;
  auVar135 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar135 = vinsertps_avx(auVar135,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_360 = vsubps_avx(_local_4a0,auVar135);
  auVar249 = vmovsldup_avx(local_360);
  auVar126 = vmovshdup_avx(local_360);
  auVar19 = vshufps_avx(local_360,local_360,0xaa);
  fVar90 = pre->ray_space[k].vx.field_0.m128[0];
  fVar150 = pre->ray_space[k].vx.field_0.m128[1];
  fVar175 = pre->ray_space[k].vx.field_0.m128[2];
  fVar176 = pre->ray_space[k].vx.field_0.m128[3];
  fVar177 = pre->ray_space[k].vy.field_0.m128[0];
  fVar202 = pre->ray_space[k].vy.field_0.m128[1];
  fVar203 = pre->ray_space[k].vy.field_0.m128[2];
  fVar204 = pre->ray_space[k].vy.field_0.m128[3];
  fVar205 = pre->ray_space[k].vz.field_0.m128[0];
  fVar229 = pre->ray_space[k].vz.field_0.m128[1];
  fVar230 = pre->ray_space[k].vz.field_0.m128[2];
  fVar231 = pre->ray_space[k].vz.field_0.m128[3];
  local_5c0._0_4_ = fVar90 * auVar249._0_4_ + fVar177 * auVar126._0_4_ + fVar205 * auVar19._0_4_;
  local_5c0._4_4_ = fVar150 * auVar249._4_4_ + fVar202 * auVar126._4_4_ + fVar229 * auVar19._4_4_;
  fStack_5b8 = fVar175 * auVar249._8_4_ + fVar203 * auVar126._8_4_ + fVar230 * auVar19._8_4_;
  fStack_5b4 = fVar176 * auVar249._12_4_ + fVar204 * auVar126._12_4_ + fVar231 * auVar19._12_4_;
  auVar71._4_4_ = fVar118;
  auVar71._0_4_ = fVar232;
  auVar71._8_4_ = fVar147;
  auVar71._12_4_ = fVar148;
  local_370 = vsubps_avx(auVar71,auVar135);
  auVar19 = vshufps_avx(local_370,local_370,0xaa);
  auVar126 = vmovshdup_avx(local_370);
  auVar249 = vmovsldup_avx(local_370);
  auVar348._0_8_ =
       CONCAT44(fVar150 * auVar249._4_4_ + fVar202 * auVar126._4_4_ + fVar229 * auVar19._4_4_,
                fVar90 * auVar249._0_4_ + fVar177 * auVar126._0_4_ + fVar205 * auVar19._0_4_);
  auVar348._8_4_ = fVar175 * auVar249._8_4_ + fVar203 * auVar126._8_4_ + fVar230 * auVar19._8_4_;
  auVar348._12_4_ = fVar176 * auVar249._12_4_ + fVar204 * auVar126._12_4_ + fVar231 * auVar19._12_4_
  ;
  local_380 = vsubps_avx(_local_4b0,auVar135);
  auVar19 = vshufps_avx(local_380,local_380,0xaa);
  auVar126 = vmovshdup_avx(local_380);
  auVar249 = vmovsldup_avx(local_380);
  auVar362._0_4_ = fVar90 * auVar249._0_4_ + fVar177 * auVar126._0_4_ + fVar205 * auVar19._0_4_;
  auVar362._4_4_ = fVar150 * auVar249._4_4_ + fVar202 * auVar126._4_4_ + fVar229 * auVar19._4_4_;
  auVar362._8_4_ = fVar175 * auVar249._8_4_ + fVar203 * auVar126._8_4_ + fVar230 * auVar19._8_4_;
  auVar362._12_4_ = fVar176 * auVar249._12_4_ + fVar204 * auVar126._12_4_ + fVar231 * auVar19._12_4_
  ;
  local_390 = vsubps_avx(_local_4c0,auVar135);
  auVar19 = vshufps_avx(local_390,local_390,0xaa);
  auVar126 = vmovshdup_avx(local_390);
  auVar249 = vmovsldup_avx(local_390);
  auVar129._0_4_ = auVar249._0_4_ * fVar90 + auVar126._0_4_ * fVar177 + fVar205 * auVar19._0_4_;
  auVar129._4_4_ = auVar249._4_4_ * fVar150 + auVar126._4_4_ * fVar202 + fVar229 * auVar19._4_4_;
  auVar129._8_4_ = auVar249._8_4_ * fVar175 + auVar126._8_4_ * fVar203 + fVar230 * auVar19._8_4_;
  auVar129._12_4_ = auVar249._12_4_ * fVar176 + auVar126._12_4_ * fVar204 + fVar231 * auVar19._12_4_
  ;
  local_3a0 = vsubps_avx(_local_4d0,auVar135);
  auVar19 = vshufps_avx(local_3a0,local_3a0,0xaa);
  auVar126 = vmovshdup_avx(local_3a0);
  auVar249 = vmovsldup_avx(local_3a0);
  auVar287._0_4_ = auVar249._0_4_ * fVar90 + auVar126._0_4_ * fVar177 + auVar19._0_4_ * fVar205;
  auVar287._4_4_ = auVar249._4_4_ * fVar150 + auVar126._4_4_ * fVar202 + auVar19._4_4_ * fVar229;
  auVar287._8_4_ = auVar249._8_4_ * fVar175 + auVar126._8_4_ * fVar203 + auVar19._8_4_ * fVar230;
  auVar287._12_4_ = auVar249._12_4_ * fVar176 + auVar126._12_4_ * fVar204 + auVar19._12_4_ * fVar231
  ;
  local_3b0 = vsubps_avx(_local_4e0,auVar135);
  auVar19 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar126 = vmovshdup_avx(local_3b0);
  auVar249 = vmovsldup_avx(local_3b0);
  auVar300._0_4_ = auVar249._0_4_ * fVar90 + auVar126._0_4_ * fVar177 + auVar19._0_4_ * fVar205;
  auVar300._4_4_ = auVar249._4_4_ * fVar150 + auVar126._4_4_ * fVar202 + auVar19._4_4_ * fVar229;
  auVar300._8_4_ = auVar249._8_4_ * fVar175 + auVar126._8_4_ * fVar203 + auVar19._8_4_ * fVar230;
  auVar300._12_4_ = auVar249._12_4_ * fVar176 + auVar126._12_4_ * fVar204 + auVar19._12_4_ * fVar231
  ;
  local_3c0 = vsubps_avx(_local_4f0,auVar135);
  auVar19 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar126 = vmovshdup_avx(local_3c0);
  auVar249 = vmovsldup_avx(local_3c0);
  auVar315._0_4_ = auVar249._0_4_ * fVar90 + auVar126._0_4_ * fVar177 + auVar19._0_4_ * fVar205;
  auVar315._4_4_ = auVar249._4_4_ * fVar150 + auVar126._4_4_ * fVar202 + auVar19._4_4_ * fVar229;
  auVar315._8_4_ = auVar249._8_4_ * fVar175 + auVar126._8_4_ * fVar203 + auVar19._8_4_ * fVar230;
  auVar315._12_4_ = auVar249._12_4_ * fVar176 + auVar126._12_4_ * fVar204 + auVar19._12_4_ * fVar231
  ;
  auVar69._4_4_ = fVar251;
  auVar69._0_4_ = fVar233;
  auVar69._8_4_ = fVar252;
  auVar69._12_4_ = fVar253;
  local_3d0 = vsubps_avx(auVar69,auVar135);
  auVar249 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar135 = vmovshdup_avx(local_3d0);
  auVar126 = vmovsldup_avx(local_3d0);
  auVar104._0_4_ = fVar90 * auVar126._0_4_ + fVar177 * auVar135._0_4_ + fVar205 * auVar249._0_4_;
  auVar104._4_4_ = fVar150 * auVar126._4_4_ + fVar202 * auVar135._4_4_ + fVar229 * auVar249._4_4_;
  auVar104._8_4_ = fVar175 * auVar126._8_4_ + fVar203 * auVar135._8_4_ + fVar230 * auVar249._8_4_;
  auVar104._12_4_ =
       fVar176 * auVar126._12_4_ + fVar204 * auVar135._12_4_ + fVar231 * auVar249._12_4_;
  auVar19 = vmovlhps_avx(_local_5c0,auVar287);
  auVar20 = vmovlhps_avx(auVar348,auVar300);
  auVar21 = vmovlhps_avx(auVar362,auVar315);
  _local_490 = vmovlhps_avx(auVar129,auVar104);
  auVar135 = vminps_avx(auVar19,auVar20);
  auVar126 = vminps_avx(auVar21,_local_490);
  auVar249 = vminps_avx(auVar135,auVar126);
  auVar135 = vmaxps_avx(auVar19,auVar20);
  auVar126 = vmaxps_avx(auVar21,_local_490);
  auVar135 = vmaxps_avx(auVar135,auVar126);
  auVar126 = vshufpd_avx(auVar249,auVar249,3);
  auVar249 = vminps_avx(auVar249,auVar126);
  auVar126 = vshufpd_avx(auVar135,auVar135,3);
  auVar126 = vmaxps_avx(auVar135,auVar126);
  auVar259._8_4_ = 0x7fffffff;
  auVar259._0_8_ = 0x7fffffff7fffffff;
  auVar259._12_4_ = 0x7fffffff;
  auVar135 = vandps_avx(auVar249,auVar259);
  auVar126 = vandps_avx(auVar126,auVar259);
  auVar135 = vmaxps_avx(auVar135,auVar126);
  auVar126 = vmovshdup_avx(auVar135);
  auVar135 = vmaxss_avx(auVar126,auVar135);
  local_528 = uVar78 + 0xf;
  fVar150 = auVar135._0_4_ * 9.536743e-07;
  register0x00001548 = auVar348._0_8_;
  local_480 = auVar348._0_8_;
  auVar135 = vshufps_avx(ZEXT416((uint)fVar150),ZEXT416((uint)fVar150),0);
  local_280._16_16_ = auVar135;
  local_280._0_16_ = auVar135;
  auVar105._0_8_ = auVar135._0_8_ ^ 0x8000000080000000;
  auVar105._8_4_ = auVar135._8_4_ ^ 0x80000000;
  auVar105._12_4_ = auVar135._12_4_ ^ 0x80000000;
  local_2a0._16_16_ = auVar105;
  local_2a0._0_16_ = auVar105;
  auVar135 = vshufps_avx(ZEXT416(uVar79),ZEXT416(uVar79),0);
  local_2c0._16_16_ = auVar135;
  local_2c0._0_16_ = auVar135;
  auVar135 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar83 * 4 + 6)),0);
  local_2e0._16_16_ = auVar135;
  local_2e0._0_16_ = auVar135;
  bVar77 = false;
  uVar85 = 0;
  fVar90 = *(float *)(ray + k * 4 + 0x60);
  _local_330 = vsubps_avx(auVar20,auVar19);
  _local_340 = vsubps_avx(auVar21,auVar20);
  _local_350 = vsubps_avx(_local_490,auVar21);
  _local_400 = vsubps_avx(_local_4d0,_local_4a0);
  auVar72._4_4_ = fVar118;
  auVar72._0_4_ = fVar232;
  auVar72._8_4_ = fVar147;
  auVar72._12_4_ = fVar148;
  _local_410 = vsubps_avx(_local_4e0,auVar72);
  _local_420 = vsubps_avx(_local_4f0,_local_4b0);
  auVar70._4_4_ = fVar251;
  auVar70._0_4_ = fVar233;
  auVar70._8_4_ = fVar252;
  auVar70._12_4_ = fVar253;
  _local_430 = vsubps_avx(auVar70,_local_4c0);
  _local_6d0 = ZEXT816(0x3f80000000000000);
  local_3e0 = _local_6d0;
  do {
    auVar135 = vshufps_avx(_local_6d0,_local_6d0,0x50);
    auVar370._8_4_ = 0x3f800000;
    auVar370._0_8_ = &DAT_3f8000003f800000;
    auVar370._12_4_ = 0x3f800000;
    auVar373._16_4_ = 0x3f800000;
    auVar373._0_16_ = auVar370;
    auVar373._20_4_ = 0x3f800000;
    auVar373._24_4_ = 0x3f800000;
    auVar373._28_4_ = 0x3f800000;
    auVar126 = vsubps_avx(auVar370,auVar135);
    fVar175 = auVar135._0_4_;
    fVar176 = auVar135._4_4_;
    fVar177 = auVar135._8_4_;
    fVar202 = auVar135._12_4_;
    fVar203 = auVar126._0_4_;
    fVar204 = auVar126._4_4_;
    fVar205 = auVar126._8_4_;
    fVar229 = auVar126._12_4_;
    auVar163._0_4_ = auVar287._0_4_ * fVar175 + fVar203 * (float)local_5c0._0_4_;
    auVar163._4_4_ = auVar287._4_4_ * fVar176 + fVar204 * (float)local_5c0._4_4_;
    auVar163._8_4_ = auVar287._0_4_ * fVar177 + fVar205 * (float)local_5c0._0_4_;
    auVar163._12_4_ = auVar287._4_4_ * fVar202 + fVar229 * (float)local_5c0._4_4_;
    auVar130._0_4_ = auVar300._0_4_ * fVar175 + local_480._0_4_ * fVar203;
    auVar130._4_4_ = auVar300._4_4_ * fVar176 + local_480._4_4_ * fVar204;
    auVar130._8_4_ = auVar300._0_4_ * fVar177 + local_480._8_4_ * fVar205;
    auVar130._12_4_ = auVar300._4_4_ * fVar202 + local_480._12_4_ * fVar229;
    auVar218._0_4_ = auVar315._0_4_ * fVar175 + auVar362._0_4_ * fVar203;
    auVar218._4_4_ = auVar315._4_4_ * fVar176 + auVar362._4_4_ * fVar204;
    auVar218._8_4_ = auVar315._0_4_ * fVar177 + auVar362._0_4_ * fVar205;
    auVar218._12_4_ = auVar315._4_4_ * fVar202 + auVar362._4_4_ * fVar229;
    auVar186._0_4_ = auVar104._0_4_ * fVar175 + auVar129._0_4_ * fVar203;
    auVar186._4_4_ = auVar104._4_4_ * fVar176 + auVar129._4_4_ * fVar204;
    auVar186._8_4_ = auVar104._0_4_ * fVar177 + auVar129._0_4_ * fVar205;
    auVar186._12_4_ = auVar104._4_4_ * fVar202 + auVar129._4_4_ * fVar229;
    auVar135 = vmovshdup_avx(local_3e0);
    auVar126 = vshufps_avx(local_3e0,local_3e0,0);
    auVar296._16_16_ = auVar126;
    auVar296._0_16_ = auVar126;
    auVar249 = vshufps_avx(local_3e0,local_3e0,0x55);
    auVar110._16_16_ = auVar249;
    auVar110._0_16_ = auVar249;
    auVar109 = vsubps_avx(auVar110,auVar296);
    auVar249 = vshufps_avx(auVar163,auVar163,0);
    auVar194 = vshufps_avx(auVar163,auVar163,0x55);
    auVar134 = vshufps_avx(auVar130,auVar130,0);
    auVar193 = vshufps_avx(auVar130,auVar130,0x55);
    auVar106 = vshufps_avx(auVar218,auVar218,0);
    auVar164 = vshufps_avx(auVar218,auVar218,0x55);
    auVar22 = vshufps_avx(auVar186,auVar186,0);
    auVar91 = vshufps_avx(auVar186,auVar186,0x55);
    auVar135 = ZEXT416((uint)((auVar135._0_4_ - local_3e0._0_4_) * 0.04761905));
    auVar135 = vshufps_avx(auVar135,auVar135,0);
    auVar309._0_4_ = auVar126._0_4_ + auVar109._0_4_ * 0.0;
    auVar309._4_4_ = auVar126._4_4_ + auVar109._4_4_ * 0.14285715;
    auVar309._8_4_ = auVar126._8_4_ + auVar109._8_4_ * 0.2857143;
    auVar309._12_4_ = auVar126._12_4_ + auVar109._12_4_ * 0.42857146;
    auVar309._16_4_ = auVar126._0_4_ + auVar109._16_4_ * 0.5714286;
    auVar309._20_4_ = auVar126._4_4_ + auVar109._20_4_ * 0.71428573;
    auVar309._24_4_ = auVar126._8_4_ + auVar109._24_4_ * 0.8571429;
    auVar309._28_4_ = auVar126._12_4_ + auVar109._28_4_;
    auVar25 = vsubps_avx(auVar373,auVar309);
    fVar117 = auVar134._0_4_;
    fVar298 = auVar134._4_4_;
    fVar329 = auVar134._8_4_;
    fVar333 = auVar134._12_4_;
    fVar175 = auVar25._0_4_;
    fVar203 = auVar25._4_4_;
    fVar230 = auVar25._8_4_;
    fVar116 = auVar25._12_4_;
    fVar356 = auVar249._12_4_;
    fVar310 = auVar25._16_4_;
    fVar311 = auVar25._20_4_;
    fVar312 = auVar25._24_4_;
    fVar322 = auVar193._0_4_;
    fVar332 = auVar193._4_4_;
    fVar368 = auVar193._8_4_;
    fVar344 = auVar193._12_4_;
    local_620 = auVar194._0_4_;
    fStack_61c = auVar194._4_4_;
    fStack_618 = auVar194._8_4_;
    fStack_614 = auVar194._12_4_;
    fVar176 = auVar106._0_4_;
    fVar202 = auVar106._4_4_;
    fVar205 = auVar106._8_4_;
    fVar231 = auVar106._12_4_;
    fVar149 = auVar309._0_4_ * fVar176 + fVar117 * fVar175;
    fVar321 = auVar309._4_4_ * fVar202 + fVar298 * fVar203;
    fVar331 = auVar309._8_4_ * fVar205 + fVar329 * fVar230;
    fVar345 = auVar309._12_4_ * fVar231 + fVar333 * fVar116;
    fVar353 = auVar309._16_4_ * fVar176 + fVar117 * fVar310;
    fVar354 = auVar309._20_4_ * fVar202 + fVar298 * fVar311;
    fVar355 = auVar309._24_4_ * fVar205 + fVar329 * fVar312;
    fVar177 = auVar164._0_4_;
    fVar204 = auVar164._4_4_;
    fVar229 = auVar164._8_4_;
    fVar89 = auVar164._12_4_;
    fVar330 = auVar309._0_4_ * fVar177 + fVar322 * fVar175;
    fVar334 = auVar309._4_4_ * fVar204 + fVar332 * fVar203;
    fVar375 = auVar309._8_4_ * fVar229 + fVar368 * fVar230;
    fVar376 = auVar309._12_4_ * fVar89 + fVar344 * fVar116;
    fVar377 = auVar309._16_4_ * fVar177 + fVar322 * fVar310;
    fVar340 = auVar309._20_4_ * fVar204 + fVar332 * fVar311;
    fVar342 = auVar309._24_4_ * fVar229 + fVar368 * fVar312;
    auVar126 = vshufps_avx(auVar163,auVar163,0xaa);
    auVar194 = vshufps_avx(auVar163,auVar163,0xff);
    fVar115 = fVar231 + 0.0;
    auVar134 = vshufps_avx(auVar130,auVar130,0xaa);
    auVar193 = vshufps_avx(auVar130,auVar130,0xff);
    auVar111._0_4_ =
         fVar175 * (fVar117 * auVar309._0_4_ + auVar249._0_4_ * fVar175) + auVar309._0_4_ * fVar149;
    auVar111._4_4_ =
         fVar203 * (fVar298 * auVar309._4_4_ + auVar249._4_4_ * fVar203) + auVar309._4_4_ * fVar321;
    auVar111._8_4_ =
         fVar230 * (fVar329 * auVar309._8_4_ + auVar249._8_4_ * fVar230) + auVar309._8_4_ * fVar331;
    auVar111._12_4_ =
         fVar116 * (fVar333 * auVar309._12_4_ + fVar356 * fVar116) + auVar309._12_4_ * fVar345;
    auVar111._16_4_ =
         fVar310 * (fVar117 * auVar309._16_4_ + auVar249._0_4_ * fVar310) +
         auVar309._16_4_ * fVar353;
    auVar111._20_4_ =
         fVar311 * (fVar298 * auVar309._20_4_ + auVar249._4_4_ * fVar311) +
         auVar309._20_4_ * fVar354;
    auVar111._24_4_ =
         fVar312 * (fVar329 * auVar309._24_4_ + auVar249._8_4_ * fVar312) +
         auVar309._24_4_ * fVar355;
    auVar111._28_4_ = fVar356 + 1.0 + fVar89;
    auVar198._0_4_ =
         fVar175 * (fVar322 * auVar309._0_4_ + fVar175 * local_620) + auVar309._0_4_ * fVar330;
    auVar198._4_4_ =
         fVar203 * (fVar332 * auVar309._4_4_ + fVar203 * fStack_61c) + auVar309._4_4_ * fVar334;
    auVar198._8_4_ =
         fVar230 * (fVar368 * auVar309._8_4_ + fVar230 * fStack_618) + auVar309._8_4_ * fVar375;
    auVar198._12_4_ =
         fVar116 * (fVar344 * auVar309._12_4_ + fVar116 * fStack_614) + auVar309._12_4_ * fVar376;
    auVar198._16_4_ =
         fVar310 * (fVar322 * auVar309._16_4_ + fVar310 * local_620) + auVar309._16_4_ * fVar377;
    auVar198._20_4_ =
         fVar311 * (fVar332 * auVar309._20_4_ + fVar311 * fStack_61c) + auVar309._20_4_ * fVar340;
    auVar198._24_4_ =
         fVar312 * (fVar368 * auVar309._24_4_ + fVar312 * fStack_618) + auVar309._24_4_ * fVar342;
    auVar198._28_4_ = fVar356 + 1.0 + fVar89;
    auVar226._0_4_ =
         fVar175 * fVar149 + auVar309._0_4_ * (auVar22._0_4_ * auVar309._0_4_ + fVar175 * fVar176);
    auVar226._4_4_ =
         fVar203 * fVar321 + auVar309._4_4_ * (auVar22._4_4_ * auVar309._4_4_ + fVar203 * fVar202);
    auVar226._8_4_ =
         fVar230 * fVar331 + auVar309._8_4_ * (auVar22._8_4_ * auVar309._8_4_ + fVar230 * fVar205);
    auVar226._12_4_ =
         fVar116 * fVar345 +
         auVar309._12_4_ * (auVar22._12_4_ * auVar309._12_4_ + fVar116 * fVar231);
    auVar226._16_4_ =
         fVar310 * fVar353 + auVar309._16_4_ * (auVar22._0_4_ * auVar309._16_4_ + fVar310 * fVar176)
    ;
    auVar226._20_4_ =
         fVar311 * fVar354 + auVar309._20_4_ * (auVar22._4_4_ * auVar309._20_4_ + fVar311 * fVar202)
    ;
    auVar226._24_4_ =
         fVar312 * fVar355 + auVar309._24_4_ * (auVar22._8_4_ * auVar309._24_4_ + fVar312 * fVar205)
    ;
    auVar226._28_4_ = fVar89 + fVar115;
    auVar320._0_4_ =
         fVar175 * fVar330 + auVar309._0_4_ * (auVar91._0_4_ * auVar309._0_4_ + fVar175 * fVar177);
    auVar320._4_4_ =
         fVar203 * fVar334 + auVar309._4_4_ * (auVar91._4_4_ * auVar309._4_4_ + fVar203 * fVar204);
    auVar320._8_4_ =
         fVar230 * fVar375 + auVar309._8_4_ * (auVar91._8_4_ * auVar309._8_4_ + fVar230 * fVar229);
    auVar320._12_4_ =
         fVar116 * fVar376 + auVar309._12_4_ * (auVar91._12_4_ * auVar309._12_4_ + fVar116 * fVar89)
    ;
    auVar320._16_4_ =
         fVar310 * fVar377 + auVar309._16_4_ * (auVar91._0_4_ * auVar309._16_4_ + fVar310 * fVar177)
    ;
    auVar320._20_4_ =
         fVar311 * fVar340 + auVar309._20_4_ * (auVar91._4_4_ * auVar309._20_4_ + fVar311 * fVar204)
    ;
    auVar320._24_4_ =
         fVar312 * fVar342 + auVar309._24_4_ * (auVar91._8_4_ * auVar309._24_4_ + fVar312 * fVar229)
    ;
    auVar320._28_4_ = fVar115 + fVar89 + 0.0;
    local_1c0._0_4_ = fVar175 * auVar111._0_4_ + auVar309._0_4_ * auVar226._0_4_;
    local_1c0._4_4_ = fVar203 * auVar111._4_4_ + auVar309._4_4_ * auVar226._4_4_;
    local_1c0._8_4_ = fVar230 * auVar111._8_4_ + auVar309._8_4_ * auVar226._8_4_;
    local_1c0._12_4_ = fVar116 * auVar111._12_4_ + auVar309._12_4_ * auVar226._12_4_;
    local_1c0._16_4_ = fVar310 * auVar111._16_4_ + auVar309._16_4_ * auVar226._16_4_;
    local_1c0._20_4_ = fVar311 * auVar111._20_4_ + auVar309._20_4_ * auVar226._20_4_;
    local_1c0._24_4_ = fVar312 * auVar111._24_4_ + auVar309._24_4_ * auVar226._24_4_;
    local_1c0._28_4_ = fVar356 + fVar333 + fVar89 + 0.0;
    local_1e0._0_4_ = fVar175 * auVar198._0_4_ + auVar309._0_4_ * auVar320._0_4_;
    local_1e0._4_4_ = fVar203 * auVar198._4_4_ + auVar309._4_4_ * auVar320._4_4_;
    local_1e0._8_4_ = fVar230 * auVar198._8_4_ + auVar309._8_4_ * auVar320._8_4_;
    local_1e0._12_4_ = fVar116 * auVar198._12_4_ + auVar309._12_4_ * auVar320._12_4_;
    local_1e0._16_4_ = fVar310 * auVar198._16_4_ + auVar309._16_4_ * auVar320._16_4_;
    local_1e0._20_4_ = fVar311 * auVar198._20_4_ + auVar309._20_4_ * auVar320._20_4_;
    local_1e0._24_4_ = fVar312 * auVar198._24_4_ + auVar309._24_4_ * auVar320._24_4_;
    local_1e0._28_4_ = fVar356 + fVar333 + fVar115;
    auVar26 = vsubps_avx(auVar226,auVar111);
    auVar109 = vsubps_avx(auVar320,auVar198);
    local_680._0_4_ = auVar135._0_4_;
    local_680._4_4_ = auVar135._4_4_;
    fStack_678 = auVar135._8_4_;
    fStack_674 = auVar135._12_4_;
    local_220 = (float)local_680._0_4_ * auVar26._0_4_ * 3.0;
    fStack_21c = (float)local_680._4_4_ * auVar26._4_4_ * 3.0;
    auVar27._4_4_ = fStack_21c;
    auVar27._0_4_ = local_220;
    fStack_218 = fStack_678 * auVar26._8_4_ * 3.0;
    auVar27._8_4_ = fStack_218;
    fStack_214 = fStack_674 * auVar26._12_4_ * 3.0;
    auVar27._12_4_ = fStack_214;
    fStack_210 = (float)local_680._0_4_ * auVar26._16_4_ * 3.0;
    auVar27._16_4_ = fStack_210;
    fStack_20c = (float)local_680._4_4_ * auVar26._20_4_ * 3.0;
    auVar27._20_4_ = fStack_20c;
    fStack_208 = fStack_678 * auVar26._24_4_ * 3.0;
    auVar27._24_4_ = fStack_208;
    auVar27._28_4_ = auVar26._28_4_;
    fVar321 = (float)local_680._0_4_ * auVar109._0_4_ * 3.0;
    fVar329 = (float)local_680._4_4_ * auVar109._4_4_ * 3.0;
    auVar28._4_4_ = fVar329;
    auVar28._0_4_ = fVar321;
    fVar331 = fStack_678 * auVar109._8_4_ * 3.0;
    auVar28._8_4_ = fVar331;
    fVar333 = fStack_674 * auVar109._12_4_ * 3.0;
    auVar28._12_4_ = fVar333;
    fVar345 = (float)local_680._0_4_ * auVar109._16_4_ * 3.0;
    auVar28._16_4_ = fVar345;
    fVar353 = (float)local_680._4_4_ * auVar109._20_4_ * 3.0;
    auVar28._20_4_ = fVar353;
    fVar354 = fStack_678 * auVar109._24_4_ * 3.0;
    auVar28._24_4_ = fVar354;
    auVar28._28_4_ = auVar226._28_4_;
    auVar27 = vsubps_avx(local_1c0,auVar27);
    auVar109 = vperm2f128_avx(auVar27,auVar27,1);
    auVar109 = vshufps_avx(auVar109,auVar27,0x30);
    auVar109 = vshufps_avx(auVar27,auVar109,0x29);
    auVar28 = vsubps_avx(local_1e0,auVar28);
    auVar27 = vperm2f128_avx(auVar28,auVar28,1);
    auVar27 = vshufps_avx(auVar27,auVar28,0x30);
    auVar110 = vshufps_avx(auVar28,auVar27,0x29);
    fVar358 = auVar134._0_4_;
    fVar366 = auVar134._4_4_;
    fVar367 = auVar134._8_4_;
    fVar176 = auVar193._0_4_;
    fVar204 = auVar193._4_4_;
    fVar231 = auVar193._8_4_;
    fVar117 = auVar193._12_4_;
    fVar357 = auVar194._12_4_;
    auVar135 = vshufps_avx(auVar218,auVar218,0xaa);
    fVar177 = auVar135._0_4_;
    fVar205 = auVar135._4_4_;
    fVar89 = auVar135._8_4_;
    fVar149 = auVar135._12_4_;
    fVar376 = auVar309._0_4_ * fVar177 + fVar358 * fVar175;
    fVar377 = auVar309._4_4_ * fVar205 + fVar366 * fVar203;
    fVar340 = auVar309._8_4_ * fVar89 + fVar367 * fVar230;
    fVar342 = auVar309._12_4_ * fVar149 + auVar134._12_4_ * fVar116;
    fVar339 = auVar309._16_4_ * fVar177 + fVar358 * fVar310;
    fVar341 = auVar309._20_4_ * fVar205 + fVar366 * fVar311;
    fVar343 = auVar309._24_4_ * fVar89 + fVar367 * fVar312;
    fVar344 = fVar357 + fVar356 + fVar344;
    auVar135 = vshufps_avx(auVar218,auVar218,0xff);
    fVar202 = auVar135._0_4_;
    fVar229 = auVar135._4_4_;
    fVar115 = auVar135._8_4_;
    fVar298 = auVar135._12_4_;
    fVar355 = auVar309._0_4_ * fVar202 + fVar175 * fVar176;
    fVar322 = auVar309._4_4_ * fVar229 + fVar203 * fVar204;
    fVar330 = auVar309._8_4_ * fVar115 + fVar230 * fVar231;
    fVar332 = auVar309._12_4_ * fVar298 + fVar116 * fVar117;
    fVar334 = auVar309._16_4_ * fVar202 + fVar310 * fVar176;
    fVar368 = auVar309._20_4_ * fVar229 + fVar311 * fVar204;
    fVar375 = auVar309._24_4_ * fVar115 + fVar312 * fVar231;
    auVar135 = vshufps_avx(auVar186,auVar186,0xaa);
    auVar249 = vshufps_avx(auVar186,auVar186,0xff);
    fVar356 = auVar249._12_4_;
    auVar112._0_4_ =
         auVar309._0_4_ * fVar376 + fVar175 * (fVar358 * auVar309._0_4_ + auVar126._0_4_ * fVar175);
    auVar112._4_4_ =
         auVar309._4_4_ * fVar377 + fVar203 * (fVar366 * auVar309._4_4_ + auVar126._4_4_ * fVar203);
    auVar112._8_4_ =
         auVar309._8_4_ * fVar340 + fVar230 * (fVar367 * auVar309._8_4_ + auVar126._8_4_ * fVar230);
    auVar112._12_4_ =
         auVar309._12_4_ * fVar342 +
         fVar116 * (auVar134._12_4_ * auVar309._12_4_ + auVar126._12_4_ * fVar116);
    auVar112._16_4_ =
         auVar309._16_4_ * fVar339 +
         fVar310 * (fVar358 * auVar309._16_4_ + auVar126._0_4_ * fVar310);
    auVar112._20_4_ =
         auVar309._20_4_ * fVar341 +
         fVar311 * (fVar366 * auVar309._20_4_ + auVar126._4_4_ * fVar311);
    auVar112._24_4_ =
         auVar309._24_4_ * fVar343 +
         fVar312 * (fVar367 * auVar309._24_4_ + auVar126._8_4_ * fVar312);
    auVar112._28_4_ = fVar356 + auVar28._28_4_ + auVar27._28_4_;
    auVar352._0_4_ =
         auVar309._0_4_ * fVar355 + fVar175 * (auVar309._0_4_ * fVar176 + auVar194._0_4_ * fVar175);
    auVar352._4_4_ =
         auVar309._4_4_ * fVar322 + fVar203 * (auVar309._4_4_ * fVar204 + auVar194._4_4_ * fVar203);
    auVar352._8_4_ =
         auVar309._8_4_ * fVar330 + fVar230 * (auVar309._8_4_ * fVar231 + auVar194._8_4_ * fVar230);
    auVar352._12_4_ =
         auVar309._12_4_ * fVar332 + fVar116 * (auVar309._12_4_ * fVar117 + fVar357 * fVar116);
    auVar352._16_4_ =
         auVar309._16_4_ * fVar334 +
         fVar310 * (auVar309._16_4_ * fVar176 + auVar194._0_4_ * fVar310);
    auVar352._20_4_ =
         auVar309._20_4_ * fVar368 +
         fVar311 * (auVar309._20_4_ * fVar204 + auVar194._4_4_ * fVar311);
    auVar352._24_4_ =
         auVar309._24_4_ * fVar375 +
         fVar312 * (auVar309._24_4_ * fVar231 + auVar194._8_4_ * fVar312);
    auVar352._28_4_ = fVar356 + auVar27._28_4_ + auVar226._28_4_;
    auVar27 = vperm2f128_avx(local_1c0,local_1c0,1);
    auVar27 = vshufps_avx(auVar27,local_1c0,0x30);
    auVar111 = vshufps_avx(local_1c0,auVar27,0x29);
    auVar227._0_4_ =
         fVar175 * fVar376 + auVar309._0_4_ * (auVar135._0_4_ * auVar309._0_4_ + fVar175 * fVar177);
    auVar227._4_4_ =
         fVar203 * fVar377 + auVar309._4_4_ * (auVar135._4_4_ * auVar309._4_4_ + fVar203 * fVar205);
    auVar227._8_4_ =
         fVar230 * fVar340 + auVar309._8_4_ * (auVar135._8_4_ * auVar309._8_4_ + fVar230 * fVar89);
    auVar227._12_4_ =
         fVar116 * fVar342 +
         auVar309._12_4_ * (auVar135._12_4_ * auVar309._12_4_ + fVar116 * fVar149);
    auVar227._16_4_ =
         fVar310 * fVar339 +
         auVar309._16_4_ * (auVar135._0_4_ * auVar309._16_4_ + fVar310 * fVar177);
    auVar227._20_4_ =
         fVar311 * fVar341 +
         auVar309._20_4_ * (auVar135._4_4_ * auVar309._20_4_ + fVar311 * fVar205);
    auVar227._24_4_ =
         fVar312 * fVar343 + auVar309._24_4_ * (auVar135._8_4_ * auVar309._24_4_ + fVar312 * fVar89)
    ;
    auVar227._28_4_ = fVar344 + auVar135._12_4_ + fVar149;
    auVar264._0_4_ =
         fVar175 * fVar355 + auVar309._0_4_ * (auVar249._0_4_ * auVar309._0_4_ + fVar175 * fVar202);
    auVar264._4_4_ =
         fVar203 * fVar322 + auVar309._4_4_ * (auVar249._4_4_ * auVar309._4_4_ + fVar203 * fVar229);
    auVar264._8_4_ =
         fVar230 * fVar330 + auVar309._8_4_ * (auVar249._8_4_ * auVar309._8_4_ + fVar230 * fVar115);
    auVar264._12_4_ =
         fVar116 * fVar332 + auVar309._12_4_ * (fVar356 * auVar309._12_4_ + fVar116 * fVar298);
    auVar264._16_4_ =
         fVar310 * fVar334 +
         auVar309._16_4_ * (auVar249._0_4_ * auVar309._16_4_ + fVar310 * fVar202);
    auVar264._20_4_ =
         fVar311 * fVar368 +
         auVar309._20_4_ * (auVar249._4_4_ * auVar309._20_4_ + fVar311 * fVar229);
    auVar264._24_4_ =
         fVar312 * fVar375 +
         auVar309._24_4_ * (auVar249._8_4_ * auVar309._24_4_ + fVar312 * fVar115);
    auVar264._28_4_ = fVar357 + fVar117 + fVar356 + fVar298;
    auVar276._0_4_ = fVar175 * auVar112._0_4_ + auVar309._0_4_ * auVar227._0_4_;
    auVar276._4_4_ = fVar203 * auVar112._4_4_ + auVar309._4_4_ * auVar227._4_4_;
    auVar276._8_4_ = fVar230 * auVar112._8_4_ + auVar309._8_4_ * auVar227._8_4_;
    auVar276._12_4_ = fVar116 * auVar112._12_4_ + auVar309._12_4_ * auVar227._12_4_;
    auVar276._16_4_ = fVar310 * auVar112._16_4_ + auVar309._16_4_ * auVar227._16_4_;
    auVar276._20_4_ = fVar311 * auVar112._20_4_ + auVar309._20_4_ * auVar227._20_4_;
    auVar276._24_4_ = fVar312 * auVar112._24_4_ + auVar309._24_4_ * auVar227._24_4_;
    auVar276._28_4_ = fVar344 + fVar356 + fVar298;
    auVar297._0_4_ = fVar175 * auVar352._0_4_ + auVar309._0_4_ * auVar264._0_4_;
    auVar297._4_4_ = fVar203 * auVar352._4_4_ + auVar309._4_4_ * auVar264._4_4_;
    auVar297._8_4_ = fVar230 * auVar352._8_4_ + auVar309._8_4_ * auVar264._8_4_;
    auVar297._12_4_ = fVar116 * auVar352._12_4_ + auVar309._12_4_ * auVar264._12_4_;
    auVar297._16_4_ = fVar310 * auVar352._16_4_ + auVar309._16_4_ * auVar264._16_4_;
    auVar297._20_4_ = fVar311 * auVar352._20_4_ + auVar309._20_4_ * auVar264._20_4_;
    auVar297._24_4_ = fVar312 * auVar352._24_4_ + auVar309._24_4_ * auVar264._24_4_;
    auVar297._28_4_ = auVar25._28_4_ + auVar309._28_4_;
    auVar27 = vsubps_avx(auVar227,auVar112);
    auVar25 = vsubps_avx(auVar264,auVar352);
    local_240 = (float)local_680._0_4_ * auVar27._0_4_ * 3.0;
    fStack_23c = (float)local_680._4_4_ * auVar27._4_4_ * 3.0;
    auVar23._4_4_ = fStack_23c;
    auVar23._0_4_ = local_240;
    fStack_238 = fStack_678 * auVar27._8_4_ * 3.0;
    auVar23._8_4_ = fStack_238;
    fStack_234 = fStack_674 * auVar27._12_4_ * 3.0;
    auVar23._12_4_ = fStack_234;
    fStack_230 = (float)local_680._0_4_ * auVar27._16_4_ * 3.0;
    auVar23._16_4_ = fStack_230;
    fStack_22c = (float)local_680._4_4_ * auVar27._20_4_ * 3.0;
    auVar23._20_4_ = fStack_22c;
    fStack_228 = fStack_678 * auVar27._24_4_ * 3.0;
    auVar23._24_4_ = fStack_228;
    auVar23._28_4_ = auVar264._28_4_;
    local_260 = (float)local_680._0_4_ * auVar25._0_4_ * 3.0;
    fStack_25c = (float)local_680._4_4_ * auVar25._4_4_ * 3.0;
    auVar24._4_4_ = fStack_25c;
    auVar24._0_4_ = local_260;
    fStack_258 = fStack_678 * auVar25._8_4_ * 3.0;
    auVar24._8_4_ = fStack_258;
    fStack_254 = fStack_674 * auVar25._12_4_ * 3.0;
    auVar24._12_4_ = fStack_254;
    local_680._0_4_ = (float)local_680._0_4_ * auVar25._16_4_ * 3.0;
    auVar24._16_4_ = local_680._0_4_;
    local_680._4_4_ = (float)local_680._4_4_ * auVar25._20_4_ * 3.0;
    auVar24._20_4_ = local_680._4_4_;
    fStack_678 = fStack_678 * auVar25._24_4_ * 3.0;
    auVar24._24_4_ = fStack_678;
    auVar24._28_4_ = fStack_674;
    auVar27 = vperm2f128_avx(auVar276,auVar276,1);
    auVar27 = vshufps_avx(auVar27,auVar276,0x30);
    auVar112 = vshufps_avx(auVar276,auVar27,0x29);
    auVar25 = vsubps_avx(auVar276,auVar23);
    auVar27 = vperm2f128_avx(auVar25,auVar25,1);
    auVar27 = vshufps_avx(auVar27,auVar25,0x30);
    auVar23 = vshufps_avx(auVar25,auVar27,0x29);
    auVar25 = vsubps_avx(auVar297,auVar24);
    auVar27 = vperm2f128_avx(auVar25,auVar25,1);
    auVar27 = vshufps_avx(auVar27,auVar25,0x30);
    auVar24 = vshufps_avx(auVar25,auVar27,0x29);
    auVar28 = vsubps_avx(auVar276,local_1c0);
    auVar29 = vsubps_avx(auVar112,auVar111);
    fVar175 = auVar29._0_4_ + auVar28._0_4_;
    fVar176 = auVar29._4_4_ + auVar28._4_4_;
    fVar177 = auVar29._8_4_ + auVar28._8_4_;
    fVar202 = auVar29._12_4_ + auVar28._12_4_;
    fVar203 = auVar29._16_4_ + auVar28._16_4_;
    fVar204 = auVar29._20_4_ + auVar28._20_4_;
    fVar205 = auVar29._24_4_ + auVar28._24_4_;
    auVar25 = vperm2f128_avx(local_1e0,local_1e0,1);
    auVar25 = vshufps_avx(auVar25,local_1e0,0x30);
    local_200 = vshufps_avx(local_1e0,auVar25,0x29);
    auVar25 = vperm2f128_avx(auVar297,auVar297,1);
    auVar25 = vshufps_avx(auVar25,auVar297,0x30);
    auVar198 = vshufps_avx(auVar297,auVar25,0x29);
    auVar25 = vsubps_avx(auVar297,local_1e0);
    auVar227 = vsubps_avx(auVar198,local_200);
    fVar229 = auVar25._0_4_ + auVar227._0_4_;
    fVar230 = auVar25._4_4_ + auVar227._4_4_;
    fVar231 = auVar25._8_4_ + auVar227._8_4_;
    fVar89 = auVar25._12_4_ + auVar227._12_4_;
    fVar115 = auVar25._16_4_ + auVar227._16_4_;
    fVar116 = auVar25._20_4_ + auVar227._20_4_;
    fVar117 = auVar25._24_4_ + auVar227._24_4_;
    fVar149 = auVar25._28_4_;
    auVar25._4_4_ = local_1e0._4_4_ * fVar176;
    auVar25._0_4_ = local_1e0._0_4_ * fVar175;
    auVar25._8_4_ = local_1e0._8_4_ * fVar177;
    auVar25._12_4_ = local_1e0._12_4_ * fVar202;
    auVar25._16_4_ = local_1e0._16_4_ * fVar203;
    auVar25._20_4_ = local_1e0._20_4_ * fVar204;
    auVar25._24_4_ = local_1e0._24_4_ * fVar205;
    auVar25._28_4_ = fVar149;
    auVar30._4_4_ = fVar230 * local_1c0._4_4_;
    auVar30._0_4_ = fVar229 * local_1c0._0_4_;
    auVar30._8_4_ = fVar231 * local_1c0._8_4_;
    auVar30._12_4_ = fVar89 * local_1c0._12_4_;
    auVar30._16_4_ = fVar115 * local_1c0._16_4_;
    auVar30._20_4_ = fVar116 * local_1c0._20_4_;
    auVar30._24_4_ = fVar117 * local_1c0._24_4_;
    auVar30._28_4_ = auVar27._28_4_;
    auVar25 = vsubps_avx(auVar25,auVar30);
    local_220 = local_1c0._0_4_ + local_220;
    fStack_21c = local_1c0._4_4_ + fStack_21c;
    fStack_218 = local_1c0._8_4_ + fStack_218;
    fStack_214 = local_1c0._12_4_ + fStack_214;
    fStack_210 = local_1c0._16_4_ + fStack_210;
    fStack_20c = local_1c0._20_4_ + fStack_20c;
    fStack_208 = local_1c0._24_4_ + fStack_208;
    fStack_204 = local_1c0._28_4_ + auVar26._28_4_;
    fVar321 = local_1e0._0_4_ + fVar321;
    fVar329 = local_1e0._4_4_ + fVar329;
    fVar331 = local_1e0._8_4_ + fVar331;
    fVar333 = local_1e0._12_4_ + fVar333;
    fVar345 = local_1e0._16_4_ + fVar345;
    fVar353 = local_1e0._20_4_ + fVar353;
    fVar354 = local_1e0._24_4_ + fVar354;
    auVar26._4_4_ = fVar329 * fVar176;
    auVar26._0_4_ = fVar321 * fVar175;
    auVar26._8_4_ = fVar331 * fVar177;
    auVar26._12_4_ = fVar333 * fVar202;
    auVar26._16_4_ = fVar345 * fVar203;
    auVar26._20_4_ = fVar353 * fVar204;
    auVar26._24_4_ = fVar354 * fVar205;
    auVar26._28_4_ = fVar149;
    auVar31._4_4_ = fVar230 * fStack_21c;
    auVar31._0_4_ = fVar229 * local_220;
    auVar31._8_4_ = fVar231 * fStack_218;
    auVar31._12_4_ = fVar89 * fStack_214;
    auVar31._16_4_ = fVar115 * fStack_210;
    auVar31._20_4_ = fVar116 * fStack_20c;
    auVar31._24_4_ = fVar117 * fStack_208;
    auVar31._28_4_ = fStack_204;
    auVar26 = vsubps_avx(auVar26,auVar31);
    auVar32._4_4_ = auVar110._4_4_ * fVar176;
    auVar32._0_4_ = auVar110._0_4_ * fVar175;
    auVar32._8_4_ = auVar110._8_4_ * fVar177;
    auVar32._12_4_ = auVar110._12_4_ * fVar202;
    auVar32._16_4_ = auVar110._16_4_ * fVar203;
    auVar32._20_4_ = auVar110._20_4_ * fVar204;
    auVar32._24_4_ = auVar110._24_4_ * fVar205;
    auVar32._28_4_ = fVar149;
    local_620 = auVar109._0_4_;
    fStack_61c = auVar109._4_4_;
    fStack_618 = auVar109._8_4_;
    fStack_614 = auVar109._12_4_;
    fStack_610 = auVar109._16_4_;
    fStack_60c = auVar109._20_4_;
    fStack_608 = auVar109._24_4_;
    auVar33._4_4_ = fVar230 * fStack_61c;
    auVar33._0_4_ = fVar229 * local_620;
    auVar33._8_4_ = fVar231 * fStack_618;
    auVar33._12_4_ = fVar89 * fStack_614;
    auVar33._16_4_ = fVar115 * fStack_610;
    auVar33._20_4_ = fVar116 * fStack_60c;
    auVar33._24_4_ = fVar117 * fStack_608;
    auVar33._28_4_ = 0x40400000;
    auVar30 = vsubps_avx(auVar32,auVar33);
    auVar34._4_4_ = local_200._4_4_ * fVar176;
    auVar34._0_4_ = local_200._0_4_ * fVar175;
    auVar34._8_4_ = local_200._8_4_ * fVar177;
    auVar34._12_4_ = local_200._12_4_ * fVar202;
    auVar34._16_4_ = local_200._16_4_ * fVar203;
    auVar34._20_4_ = local_200._20_4_ * fVar204;
    auVar34._24_4_ = local_200._24_4_ * fVar205;
    auVar34._28_4_ = fVar149;
    auVar35._4_4_ = auVar111._4_4_ * fVar230;
    auVar35._0_4_ = auVar111._0_4_ * fVar229;
    auVar35._8_4_ = auVar111._8_4_ * fVar231;
    auVar35._12_4_ = auVar111._12_4_ * fVar89;
    auVar35._16_4_ = auVar111._16_4_ * fVar115;
    auVar35._20_4_ = auVar111._20_4_ * fVar116;
    auVar35._24_4_ = auVar111._24_4_ * fVar117;
    auVar35._28_4_ = local_200._28_4_;
    auVar31 = vsubps_avx(auVar34,auVar35);
    auVar36._4_4_ = auVar297._4_4_ * fVar176;
    auVar36._0_4_ = auVar297._0_4_ * fVar175;
    auVar36._8_4_ = auVar297._8_4_ * fVar177;
    auVar36._12_4_ = auVar297._12_4_ * fVar202;
    auVar36._16_4_ = auVar297._16_4_ * fVar203;
    auVar36._20_4_ = auVar297._20_4_ * fVar204;
    auVar36._24_4_ = auVar297._24_4_ * fVar205;
    auVar36._28_4_ = fVar149;
    auVar37._4_4_ = fVar230 * auVar276._4_4_;
    auVar37._0_4_ = fVar229 * auVar276._0_4_;
    auVar37._8_4_ = fVar231 * auVar276._8_4_;
    auVar37._12_4_ = fVar89 * auVar276._12_4_;
    auVar37._16_4_ = fVar115 * auVar276._16_4_;
    auVar37._20_4_ = fVar116 * auVar276._20_4_;
    auVar37._24_4_ = fVar117 * auVar276._24_4_;
    auVar37._28_4_ = auVar110._28_4_;
    auVar32 = vsubps_avx(auVar36,auVar37);
    local_240 = auVar276._0_4_ + local_240;
    fStack_23c = auVar276._4_4_ + fStack_23c;
    fStack_238 = auVar276._8_4_ + fStack_238;
    fStack_234 = auVar276._12_4_ + fStack_234;
    fStack_230 = auVar276._16_4_ + fStack_230;
    fStack_22c = auVar276._20_4_ + fStack_22c;
    fStack_228 = auVar276._24_4_ + fStack_228;
    fStack_224 = auVar276._28_4_ + auVar264._28_4_;
    local_260 = auVar297._0_4_ + local_260;
    fStack_25c = auVar297._4_4_ + fStack_25c;
    fStack_258 = auVar297._8_4_ + fStack_258;
    fStack_254 = auVar297._12_4_ + fStack_254;
    fStack_250 = auVar297._16_4_ + (float)local_680._0_4_;
    fStack_24c = auVar297._20_4_ + (float)local_680._4_4_;
    fStack_248 = auVar297._24_4_ + fStack_678;
    fStack_244 = auVar297._28_4_ + fStack_674;
    auVar38._4_4_ = fStack_25c * fVar176;
    auVar38._0_4_ = local_260 * fVar175;
    auVar38._8_4_ = fStack_258 * fVar177;
    auVar38._12_4_ = fStack_254 * fVar202;
    auVar38._16_4_ = fStack_250 * fVar203;
    auVar38._20_4_ = fStack_24c * fVar204;
    auVar38._24_4_ = fStack_248 * fVar205;
    auVar38._28_4_ = auVar297._28_4_ + fStack_674;
    auVar39._4_4_ = fStack_23c * fVar230;
    auVar39._0_4_ = local_240 * fVar229;
    auVar39._8_4_ = fStack_238 * fVar231;
    auVar39._12_4_ = fStack_234 * fVar89;
    auVar39._16_4_ = fStack_230 * fVar115;
    auVar39._20_4_ = fStack_22c * fVar116;
    auVar39._24_4_ = fStack_228 * fVar117;
    auVar39._28_4_ = fStack_224;
    auVar33 = vsubps_avx(auVar38,auVar39);
    auVar40._4_4_ = auVar24._4_4_ * fVar176;
    auVar40._0_4_ = auVar24._0_4_ * fVar175;
    auVar40._8_4_ = auVar24._8_4_ * fVar177;
    auVar40._12_4_ = auVar24._12_4_ * fVar202;
    auVar40._16_4_ = auVar24._16_4_ * fVar203;
    auVar40._20_4_ = auVar24._20_4_ * fVar204;
    auVar40._24_4_ = auVar24._24_4_ * fVar205;
    auVar40._28_4_ = fStack_224;
    auVar41._4_4_ = fVar230 * auVar23._4_4_;
    auVar41._0_4_ = fVar229 * auVar23._0_4_;
    auVar41._8_4_ = fVar231 * auVar23._8_4_;
    auVar41._12_4_ = fVar89 * auVar23._12_4_;
    auVar41._16_4_ = fVar115 * auVar23._16_4_;
    auVar41._20_4_ = fVar116 * auVar23._20_4_;
    auVar41._24_4_ = fVar117 * auVar23._24_4_;
    auVar41._28_4_ = auVar23._28_4_;
    auVar34 = vsubps_avx(auVar40,auVar41);
    auVar42._4_4_ = auVar198._4_4_ * fVar176;
    auVar42._0_4_ = auVar198._0_4_ * fVar175;
    auVar42._8_4_ = auVar198._8_4_ * fVar177;
    auVar42._12_4_ = auVar198._12_4_ * fVar202;
    auVar42._16_4_ = auVar198._16_4_ * fVar203;
    auVar42._20_4_ = auVar198._20_4_ * fVar204;
    auVar42._24_4_ = auVar198._24_4_ * fVar205;
    auVar42._28_4_ = auVar29._28_4_ + auVar28._28_4_;
    auVar29._4_4_ = auVar112._4_4_ * fVar230;
    auVar29._0_4_ = auVar112._0_4_ * fVar229;
    auVar29._8_4_ = auVar112._8_4_ * fVar231;
    auVar29._12_4_ = auVar112._12_4_ * fVar89;
    auVar29._16_4_ = auVar112._16_4_ * fVar115;
    auVar29._20_4_ = auVar112._20_4_ * fVar116;
    auVar29._24_4_ = auVar112._24_4_ * fVar117;
    auVar29._28_4_ = fVar149 + auVar227._28_4_;
    auVar29 = vsubps_avx(auVar42,auVar29);
    auVar27 = vminps_avx(auVar25,auVar26);
    auVar109 = vmaxps_avx(auVar25,auVar26);
    auVar25 = vminps_avx(auVar30,auVar31);
    auVar25 = vminps_avx(auVar27,auVar25);
    auVar27 = vmaxps_avx(auVar30,auVar31);
    auVar109 = vmaxps_avx(auVar109,auVar27);
    auVar26 = vminps_avx(auVar32,auVar33);
    auVar27 = vmaxps_avx(auVar32,auVar33);
    auVar28 = vminps_avx(auVar34,auVar29);
    auVar26 = vminps_avx(auVar26,auVar28);
    auVar26 = vminps_avx(auVar25,auVar26);
    auVar25 = vmaxps_avx(auVar34,auVar29);
    auVar27 = vmaxps_avx(auVar27,auVar25);
    auVar27 = vmaxps_avx(auVar109,auVar27);
    auVar109 = vcmpps_avx(auVar26,local_280,2);
    auVar27 = vcmpps_avx(auVar27,local_2a0,5);
    auVar109 = vandps_avx(auVar27,auVar109);
    auVar27 = local_320 & auVar109;
    uVar80 = 0;
    if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar27 >> 0x7f,0) != '\0') ||
          (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar27 >> 0xbf,0) != '\0') ||
        (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar27[0x1f] < '\0')
    {
      auVar27 = vsubps_avx(auVar111,local_1c0);
      auVar25 = vsubps_avx(auVar112,auVar276);
      fVar176 = auVar27._0_4_ + auVar25._0_4_;
      fVar177 = auVar27._4_4_ + auVar25._4_4_;
      fVar202 = auVar27._8_4_ + auVar25._8_4_;
      fVar203 = auVar27._12_4_ + auVar25._12_4_;
      fVar204 = auVar27._16_4_ + auVar25._16_4_;
      fVar205 = auVar27._20_4_ + auVar25._20_4_;
      fVar229 = auVar27._24_4_ + auVar25._24_4_;
      auVar26 = vsubps_avx(local_200,local_1e0);
      auVar28 = vsubps_avx(auVar198,auVar297);
      fVar230 = auVar26._0_4_ + auVar28._0_4_;
      fVar231 = auVar26._4_4_ + auVar28._4_4_;
      fVar89 = auVar26._8_4_ + auVar28._8_4_;
      fVar115 = auVar26._12_4_ + auVar28._12_4_;
      fVar116 = auVar26._16_4_ + auVar28._16_4_;
      fVar117 = auVar26._20_4_ + auVar28._20_4_;
      fVar149 = auVar26._24_4_ + auVar28._24_4_;
      fVar175 = auVar28._28_4_;
      auVar43._4_4_ = local_1e0._4_4_ * fVar177;
      auVar43._0_4_ = local_1e0._0_4_ * fVar176;
      auVar43._8_4_ = local_1e0._8_4_ * fVar202;
      auVar43._12_4_ = local_1e0._12_4_ * fVar203;
      auVar43._16_4_ = local_1e0._16_4_ * fVar204;
      auVar43._20_4_ = local_1e0._20_4_ * fVar205;
      auVar43._24_4_ = local_1e0._24_4_ * fVar229;
      auVar43._28_4_ = local_1e0._28_4_;
      auVar44._4_4_ = local_1c0._4_4_ * fVar231;
      auVar44._0_4_ = local_1c0._0_4_ * fVar230;
      auVar44._8_4_ = local_1c0._8_4_ * fVar89;
      auVar44._12_4_ = local_1c0._12_4_ * fVar115;
      auVar44._16_4_ = local_1c0._16_4_ * fVar116;
      auVar44._20_4_ = local_1c0._20_4_ * fVar117;
      auVar44._24_4_ = local_1c0._24_4_ * fVar149;
      auVar44._28_4_ = local_1c0._28_4_;
      auVar28 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = fVar329 * fVar177;
      auVar45._0_4_ = fVar321 * fVar176;
      auVar45._8_4_ = fVar331 * fVar202;
      auVar45._12_4_ = fVar333 * fVar203;
      auVar45._16_4_ = fVar345 * fVar204;
      auVar45._20_4_ = fVar353 * fVar205;
      auVar45._24_4_ = fVar354 * fVar229;
      auVar45._28_4_ = local_1e0._28_4_;
      auVar46._4_4_ = fVar231 * fStack_21c;
      auVar46._0_4_ = fVar230 * local_220;
      auVar46._8_4_ = fVar89 * fStack_218;
      auVar46._12_4_ = fVar115 * fStack_214;
      auVar46._16_4_ = fVar116 * fStack_210;
      auVar46._20_4_ = fVar117 * fStack_20c;
      auVar46._24_4_ = fVar149 * fStack_208;
      auVar46._28_4_ = fVar175;
      auVar29 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = fVar177 * auVar110._4_4_;
      auVar47._0_4_ = fVar176 * auVar110._0_4_;
      auVar47._8_4_ = fVar202 * auVar110._8_4_;
      auVar47._12_4_ = fVar203 * auVar110._12_4_;
      auVar47._16_4_ = fVar204 * auVar110._16_4_;
      auVar47._20_4_ = fVar205 * auVar110._20_4_;
      auVar47._24_4_ = fVar229 * auVar110._24_4_;
      auVar47._28_4_ = fVar175;
      auVar48._4_4_ = fVar231 * fStack_61c;
      auVar48._0_4_ = fVar230 * local_620;
      auVar48._8_4_ = fVar89 * fStack_618;
      auVar48._12_4_ = fVar115 * fStack_614;
      auVar48._16_4_ = fVar116 * fStack_610;
      auVar48._20_4_ = fVar117 * fStack_60c;
      auVar48._24_4_ = fVar149 * fStack_608;
      auVar48._28_4_ = local_1e0._28_4_ + auVar226._28_4_;
      auVar110 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = local_200._4_4_ * fVar177;
      auVar49._0_4_ = local_200._0_4_ * fVar176;
      auVar49._8_4_ = local_200._8_4_ * fVar202;
      auVar49._12_4_ = local_200._12_4_ * fVar203;
      auVar49._16_4_ = local_200._16_4_ * fVar204;
      auVar49._20_4_ = local_200._20_4_ * fVar205;
      auVar49._24_4_ = local_200._24_4_ * fVar229;
      auVar49._28_4_ = local_1e0._28_4_ + auVar226._28_4_;
      auVar50._4_4_ = auVar111._4_4_ * fVar231;
      auVar50._0_4_ = auVar111._0_4_ * fVar230;
      auVar50._8_4_ = auVar111._8_4_ * fVar89;
      auVar50._12_4_ = auVar111._12_4_ * fVar115;
      auVar50._16_4_ = auVar111._16_4_ * fVar116;
      auVar50._20_4_ = auVar111._20_4_ * fVar117;
      uVar9 = auVar111._28_4_;
      auVar50._24_4_ = auVar111._24_4_ * fVar149;
      auVar50._28_4_ = uVar9;
      auVar111 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = auVar297._4_4_ * fVar177;
      auVar51._0_4_ = auVar297._0_4_ * fVar176;
      auVar51._8_4_ = auVar297._8_4_ * fVar202;
      auVar51._12_4_ = auVar297._12_4_ * fVar203;
      auVar51._16_4_ = auVar297._16_4_ * fVar204;
      auVar51._20_4_ = auVar297._20_4_ * fVar205;
      auVar51._24_4_ = auVar297._24_4_ * fVar229;
      auVar51._28_4_ = auVar297._28_4_;
      auVar52._4_4_ = auVar276._4_4_ * fVar231;
      auVar52._0_4_ = auVar276._0_4_ * fVar230;
      auVar52._8_4_ = auVar276._8_4_ * fVar89;
      auVar52._12_4_ = auVar276._12_4_ * fVar115;
      auVar52._16_4_ = auVar276._16_4_ * fVar116;
      auVar52._20_4_ = auVar276._20_4_ * fVar117;
      auVar52._24_4_ = auVar276._24_4_ * fVar149;
      auVar52._28_4_ = auVar276._28_4_;
      auVar227 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = fVar177 * fStack_25c;
      auVar53._0_4_ = fVar176 * local_260;
      auVar53._8_4_ = fVar202 * fStack_258;
      auVar53._12_4_ = fVar203 * fStack_254;
      auVar53._16_4_ = fVar204 * fStack_250;
      auVar53._20_4_ = fVar205 * fStack_24c;
      auVar53._24_4_ = fVar229 * fStack_248;
      auVar53._28_4_ = auVar297._28_4_;
      auVar54._4_4_ = fVar231 * fStack_23c;
      auVar54._0_4_ = fVar230 * local_240;
      auVar54._8_4_ = fVar89 * fStack_238;
      auVar54._12_4_ = fVar115 * fStack_234;
      auVar54._16_4_ = fVar116 * fStack_230;
      auVar54._20_4_ = fVar117 * fStack_22c;
      auVar54._24_4_ = fVar149 * fStack_228;
      auVar54._28_4_ = uVar9;
      auVar30 = vsubps_avx(auVar53,auVar54);
      auVar55._4_4_ = fVar177 * auVar24._4_4_;
      auVar55._0_4_ = fVar176 * auVar24._0_4_;
      auVar55._8_4_ = fVar202 * auVar24._8_4_;
      auVar55._12_4_ = fVar203 * auVar24._12_4_;
      auVar55._16_4_ = fVar204 * auVar24._16_4_;
      auVar55._20_4_ = fVar205 * auVar24._20_4_;
      auVar55._24_4_ = fVar229 * auVar24._24_4_;
      auVar55._28_4_ = uVar9;
      auVar56._4_4_ = fVar231 * auVar23._4_4_;
      auVar56._0_4_ = fVar230 * auVar23._0_4_;
      auVar56._8_4_ = fVar89 * auVar23._8_4_;
      auVar56._12_4_ = fVar115 * auVar23._12_4_;
      auVar56._16_4_ = fVar116 * auVar23._16_4_;
      auVar56._20_4_ = fVar117 * auVar23._20_4_;
      auVar56._24_4_ = fVar149 * auVar23._24_4_;
      auVar56._28_4_ = local_200._28_4_;
      auVar23 = vsubps_avx(auVar55,auVar56);
      auVar57._4_4_ = auVar198._4_4_ * fVar177;
      auVar57._0_4_ = auVar198._0_4_ * fVar176;
      auVar57._8_4_ = auVar198._8_4_ * fVar202;
      auVar57._12_4_ = auVar198._12_4_ * fVar203;
      auVar57._16_4_ = auVar198._16_4_ * fVar204;
      auVar57._20_4_ = auVar198._20_4_ * fVar205;
      auVar57._24_4_ = auVar198._24_4_ * fVar229;
      auVar57._28_4_ = auVar27._28_4_ + auVar25._28_4_;
      auVar58._4_4_ = auVar112._4_4_ * fVar231;
      auVar58._0_4_ = auVar112._0_4_ * fVar230;
      auVar58._8_4_ = auVar112._8_4_ * fVar89;
      auVar58._12_4_ = auVar112._12_4_ * fVar115;
      auVar58._16_4_ = auVar112._16_4_ * fVar116;
      auVar58._20_4_ = auVar112._20_4_ * fVar117;
      auVar58._24_4_ = auVar112._24_4_ * fVar149;
      auVar58._28_4_ = auVar26._28_4_ + fVar175;
      auVar112 = vsubps_avx(auVar57,auVar58);
      auVar25 = vminps_avx(auVar28,auVar29);
      auVar27 = vmaxps_avx(auVar28,auVar29);
      auVar26 = vminps_avx(auVar110,auVar111);
      auVar26 = vminps_avx(auVar25,auVar26);
      auVar25 = vmaxps_avx(auVar110,auVar111);
      auVar27 = vmaxps_avx(auVar27,auVar25);
      auVar28 = vminps_avx(auVar227,auVar30);
      auVar25 = vmaxps_avx(auVar227,auVar30);
      auVar110 = vminps_avx(auVar23,auVar112);
      auVar28 = vminps_avx(auVar28,auVar110);
      auVar28 = vminps_avx(auVar26,auVar28);
      auVar26 = vmaxps_avx(auVar23,auVar112);
      auVar25 = vmaxps_avx(auVar25,auVar26);
      auVar25 = vmaxps_avx(auVar27,auVar25);
      auVar27 = vcmpps_avx(auVar28,local_280,2);
      auVar25 = vcmpps_avx(auVar25,local_2a0,5);
      auVar27 = vandps_avx(auVar25,auVar27);
      auVar109 = vandps_avx(auVar109,local_320);
      auVar25 = auVar109 & auVar27;
      if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar25 >> 0x7f,0) != '\0') ||
            (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0xbf,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar25[0x1f] < '\0') {
        auVar109 = vandps_avx(auVar27,auVar109);
        uVar80 = vmovmskps_avx(auVar109);
      }
    }
    if (uVar80 != 0) {
      auStack_470[uVar85] = uVar80;
      uVar10 = vmovlps_avx(local_3e0);
      *(undefined8 *)(afStack_300 + uVar85 * 2) = uVar10;
      uVar11 = vmovlps_avx(_local_6d0);
      auStack_1a0[uVar85] = uVar11;
      uVar85 = (ulong)((int)uVar85 + 1);
    }
    auVar374 = ZEXT464(0) << 0x20;
    do {
      if ((int)uVar85 == 0) {
        if (bVar77) {
          return local_711;
        }
        uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar108._4_4_ = uVar9;
        auVar108._0_4_ = uVar9;
        auVar108._8_4_ = uVar9;
        auVar108._12_4_ = uVar9;
        auVar135 = vcmpps_avx(local_3f0,auVar108,2);
        uVar79 = vmovmskps_avx(auVar135);
        uVar78 = uVar78 & local_528 & uVar79;
        local_711 = uVar78 != 0;
        if (!local_711) {
          return local_711;
        }
        goto LAB_01003831;
      }
      uVar84 = (int)uVar85 - 1;
      uVar86 = (ulong)uVar84;
      uVar80 = auStack_470[uVar86];
      fVar175 = afStack_300[uVar86 * 2];
      fVar176 = afStack_300[uVar86 * 2 + 1];
      register0x00001588 = 0;
      local_6d0 = (undefined1  [8])auStack_1a0[uVar86];
      uVar11 = 0;
      if (uVar80 != 0) {
        for (; (uVar80 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
        }
      }
      uVar80 = uVar80 - 1 & uVar80;
      auStack_470[uVar86] = uVar80;
      if (uVar80 == 0) {
        uVar85 = (ulong)uVar84;
      }
      auVar241._8_4_ = 0x3f800000;
      auVar241._0_8_ = &DAT_3f8000003f800000;
      auVar241._12_4_ = 0x3f800000;
      fVar202 = (float)(uVar11 + 1) * 0.14285715;
      fVar177 = (1.0 - (float)uVar11 * 0.14285715) * fVar175 + fVar176 * (float)uVar11 * 0.14285715;
      fVar175 = (1.0 - fVar202) * fVar175 + fVar176 * fVar202;
      fVar176 = fVar175 - fVar177;
      if (0.16666667 <= fVar176) break;
      auVar135 = vshufps_avx(_local_6d0,_local_6d0,0x50);
      auVar126 = vsubps_avx(auVar241,auVar135);
      fVar202 = auVar135._0_4_;
      fVar203 = auVar135._4_4_;
      fVar204 = auVar135._8_4_;
      fVar205 = auVar135._12_4_;
      fVar229 = auVar126._0_4_;
      fVar230 = auVar126._4_4_;
      fVar231 = auVar126._8_4_;
      fVar89 = auVar126._12_4_;
      auVar187._0_4_ = auVar287._0_4_ * fVar202 + fVar229 * (float)local_5c0._0_4_;
      auVar187._4_4_ = auVar287._4_4_ * fVar203 + fVar230 * (float)local_5c0._4_4_;
      auVar187._8_4_ = auVar287._0_4_ * fVar204 + fVar231 * (float)local_5c0._0_4_;
      auVar187._12_4_ = auVar287._4_4_ * fVar205 + fVar89 * (float)local_5c0._4_4_;
      auVar219._0_4_ = auVar300._0_4_ * fVar202 + fVar229 * (float)local_480._0_4_;
      auVar219._4_4_ = auVar300._4_4_ * fVar203 + fVar230 * (float)local_480._4_4_;
      auVar219._8_4_ = auVar300._0_4_ * fVar204 + fVar231 * fStack_478;
      auVar219._12_4_ = auVar300._4_4_ * fVar205 + fVar89 * fStack_474;
      auVar242._0_4_ = auVar315._0_4_ * fVar202 + fVar229 * auVar362._0_4_;
      auVar242._4_4_ = auVar315._4_4_ * fVar203 + fVar230 * auVar362._4_4_;
      auVar242._8_4_ = auVar315._0_4_ * fVar204 + fVar231 * auVar362._0_4_;
      auVar242._12_4_ = auVar315._4_4_ * fVar205 + fVar89 * auVar362._4_4_;
      auVar131._0_4_ = auVar104._0_4_ * fVar202 + auVar129._0_4_ * fVar229;
      auVar131._4_4_ = auVar104._4_4_ * fVar203 + auVar129._4_4_ * fVar230;
      auVar131._8_4_ = auVar104._0_4_ * fVar204 + auVar129._0_4_ * fVar231;
      auVar131._12_4_ = auVar104._4_4_ * fVar205 + auVar129._4_4_ * fVar89;
      auVar171._16_16_ = auVar187;
      auVar171._0_16_ = auVar187;
      auVar199._16_16_ = auVar219;
      auVar199._0_16_ = auVar219;
      auVar228._16_16_ = auVar242;
      auVar228._0_16_ = auVar242;
      auVar109 = vshufps_avx(ZEXT2032(CONCAT416(fVar175,ZEXT416((uint)fVar177))),
                             ZEXT2032(CONCAT416(fVar175,ZEXT416((uint)fVar177))),0);
      auVar27 = vsubps_avx(auVar199,auVar171);
      fVar202 = auVar109._0_4_;
      fVar203 = auVar109._4_4_;
      fVar204 = auVar109._8_4_;
      fVar205 = auVar109._12_4_;
      fVar229 = auVar109._16_4_;
      fVar230 = auVar109._20_4_;
      fVar231 = auVar109._24_4_;
      auVar172._0_4_ = auVar187._0_4_ + auVar27._0_4_ * fVar202;
      auVar172._4_4_ = auVar187._4_4_ + auVar27._4_4_ * fVar203;
      auVar172._8_4_ = auVar187._8_4_ + auVar27._8_4_ * fVar204;
      auVar172._12_4_ = auVar187._12_4_ + auVar27._12_4_ * fVar205;
      auVar172._16_4_ = auVar187._0_4_ + auVar27._16_4_ * fVar229;
      auVar172._20_4_ = auVar187._4_4_ + auVar27._20_4_ * fVar230;
      auVar172._24_4_ = auVar187._8_4_ + auVar27._24_4_ * fVar231;
      auVar172._28_4_ = auVar187._12_4_ + auVar27._28_4_;
      auVar27 = vsubps_avx(auVar228,auVar199);
      auVar200._0_4_ = auVar219._0_4_ + auVar27._0_4_ * fVar202;
      auVar200._4_4_ = auVar219._4_4_ + auVar27._4_4_ * fVar203;
      auVar200._8_4_ = auVar219._8_4_ + auVar27._8_4_ * fVar204;
      auVar200._12_4_ = auVar219._12_4_ + auVar27._12_4_ * fVar205;
      auVar200._16_4_ = auVar219._0_4_ + auVar27._16_4_ * fVar229;
      auVar200._20_4_ = auVar219._4_4_ + auVar27._20_4_ * fVar230;
      auVar200._24_4_ = auVar219._8_4_ + auVar27._24_4_ * fVar231;
      auVar200._28_4_ = auVar219._12_4_ + auVar27._28_4_;
      auVar135 = vsubps_avx(auVar131,auVar242);
      auVar144._0_4_ = auVar242._0_4_ + auVar135._0_4_ * fVar202;
      auVar144._4_4_ = auVar242._4_4_ + auVar135._4_4_ * fVar203;
      auVar144._8_4_ = auVar242._8_4_ + auVar135._8_4_ * fVar204;
      auVar144._12_4_ = auVar242._12_4_ + auVar135._12_4_ * fVar205;
      auVar144._16_4_ = auVar242._0_4_ + auVar135._0_4_ * fVar229;
      auVar144._20_4_ = auVar242._4_4_ + auVar135._4_4_ * fVar230;
      auVar144._24_4_ = auVar242._8_4_ + auVar135._8_4_ * fVar231;
      auVar144._28_4_ = auVar242._12_4_ + auVar135._12_4_;
      auVar27 = vsubps_avx(auVar200,auVar172);
      auVar173._0_4_ = auVar172._0_4_ + fVar202 * auVar27._0_4_;
      auVar173._4_4_ = auVar172._4_4_ + fVar203 * auVar27._4_4_;
      auVar173._8_4_ = auVar172._8_4_ + fVar204 * auVar27._8_4_;
      auVar173._12_4_ = auVar172._12_4_ + fVar205 * auVar27._12_4_;
      auVar173._16_4_ = auVar172._16_4_ + fVar229 * auVar27._16_4_;
      auVar173._20_4_ = auVar172._20_4_ + fVar230 * auVar27._20_4_;
      auVar173._24_4_ = auVar172._24_4_ + fVar231 * auVar27._24_4_;
      auVar173._28_4_ = auVar172._28_4_ + auVar27._28_4_;
      auVar27 = vsubps_avx(auVar144,auVar200);
      auVar145._0_4_ = auVar200._0_4_ + fVar202 * auVar27._0_4_;
      auVar145._4_4_ = auVar200._4_4_ + fVar203 * auVar27._4_4_;
      auVar145._8_4_ = auVar200._8_4_ + fVar204 * auVar27._8_4_;
      auVar145._12_4_ = auVar200._12_4_ + fVar205 * auVar27._12_4_;
      auVar145._16_4_ = auVar200._16_4_ + fVar229 * auVar27._16_4_;
      auVar145._20_4_ = auVar200._20_4_ + fVar230 * auVar27._20_4_;
      auVar145._24_4_ = auVar200._24_4_ + fVar231 * auVar27._24_4_;
      auVar145._28_4_ = auVar200._28_4_ + auVar27._28_4_;
      auVar27 = vsubps_avx(auVar145,auVar173);
      auVar188._0_4_ = auVar173._0_4_ + fVar202 * auVar27._0_4_;
      auVar188._4_4_ = auVar173._4_4_ + fVar203 * auVar27._4_4_;
      auVar188._8_4_ = auVar173._8_4_ + fVar204 * auVar27._8_4_;
      auVar188._12_4_ = auVar173._12_4_ + fVar205 * auVar27._12_4_;
      auVar201._16_4_ = auVar173._16_4_ + fVar229 * auVar27._16_4_;
      auVar201._0_16_ = auVar188;
      auVar201._20_4_ = auVar173._20_4_ + fVar230 * auVar27._20_4_;
      auVar201._24_4_ = auVar173._24_4_ + fVar231 * auVar27._24_4_;
      auVar201._28_4_ = auVar173._28_4_ + auVar200._28_4_;
      fVar202 = auVar27._4_4_ * 3.0;
      auVar164 = auVar201._16_16_;
      auVar134 = vshufps_avx(ZEXT416((uint)(fVar176 * 0.33333334)),
                             ZEXT416((uint)(fVar176 * 0.33333334)),0);
      auVar301._0_4_ = auVar188._0_4_ + auVar134._0_4_ * auVar27._0_4_ * 3.0;
      auVar301._4_4_ = auVar188._4_4_ + auVar134._4_4_ * fVar202;
      auVar301._8_4_ = auVar188._8_4_ + auVar134._8_4_ * auVar27._8_4_ * 3.0;
      auVar301._12_4_ = auVar188._12_4_ + auVar134._12_4_ * auVar27._12_4_ * 3.0;
      auVar249 = vshufpd_avx(auVar188,auVar188,3);
      auVar194 = vshufpd_avx(auVar164,auVar164,3);
      auVar135 = vsubps_avx(auVar249,auVar188);
      auVar126 = vsubps_avx(auVar194,auVar164);
      auVar132._0_4_ = auVar135._0_4_ + auVar126._0_4_;
      auVar132._4_4_ = auVar135._4_4_ + auVar126._4_4_;
      auVar132._8_4_ = auVar135._8_4_ + auVar126._8_4_;
      auVar132._12_4_ = auVar135._12_4_ + auVar126._12_4_;
      auVar135 = vmovshdup_avx(auVar188);
      auVar126 = vmovshdup_avx(auVar301);
      auVar193 = vshufps_avx(auVar132,auVar132,0);
      auVar106 = vshufps_avx(auVar132,auVar132,0x55);
      fVar230 = auVar106._0_4_;
      fVar231 = auVar106._4_4_;
      fVar89 = auVar106._8_4_;
      fVar115 = auVar106._12_4_;
      fVar203 = auVar193._0_4_;
      fVar204 = auVar193._4_4_;
      fVar205 = auVar193._8_4_;
      fVar229 = auVar193._12_4_;
      auVar288._0_4_ = fVar203 * auVar188._0_4_ + fVar230 * auVar135._0_4_;
      auVar288._4_4_ = fVar204 * auVar188._4_4_ + fVar231 * auVar135._4_4_;
      auVar288._8_4_ = fVar205 * auVar188._8_4_ + fVar89 * auVar135._8_4_;
      auVar288._12_4_ = fVar229 * auVar188._12_4_ + fVar115 * auVar135._12_4_;
      auVar302._0_4_ = auVar301._0_4_ * fVar203 + fVar230 * auVar126._0_4_;
      auVar302._4_4_ = auVar301._4_4_ * fVar204 + fVar231 * auVar126._4_4_;
      auVar302._8_4_ = auVar301._8_4_ * fVar205 + fVar89 * auVar126._8_4_;
      auVar302._12_4_ = auVar301._12_4_ * fVar229 + fVar115 * auVar126._12_4_;
      auVar126 = vshufps_avx(auVar288,auVar288,0xe8);
      auVar193 = vshufps_avx(auVar302,auVar302,0xe8);
      auVar135 = vcmpps_avx(auVar126,auVar193,1);
      uVar80 = vextractps_avx(auVar135,0);
      auVar106 = auVar302;
      if ((uVar80 & 1) == 0) {
        auVar106 = auVar288;
      }
      auVar133._0_4_ = auVar134._0_4_ * auVar27._16_4_ * 3.0;
      auVar133._4_4_ = auVar134._4_4_ * fVar202;
      auVar133._8_4_ = auVar134._8_4_ * auVar27._24_4_ * 3.0;
      auVar133._12_4_ = auVar134._12_4_ * auVar109._28_4_;
      auVar91 = vsubps_avx(auVar164,auVar133);
      auVar134 = vmovshdup_avx(auVar91);
      auVar164 = vmovshdup_avx(auVar164);
      fVar202 = auVar91._0_4_;
      fVar116 = auVar91._4_4_;
      auVar371._0_4_ = fVar203 * fVar202 + fVar230 * auVar134._0_4_;
      auVar371._4_4_ = fVar204 * fVar116 + fVar231 * auVar134._4_4_;
      auVar371._8_4_ = fVar205 * auVar91._8_4_ + fVar89 * auVar134._8_4_;
      auVar371._12_4_ = fVar229 * auVar91._12_4_ + fVar115 * auVar134._12_4_;
      auVar349._0_4_ = fVar203 * auVar201._16_4_ + fVar230 * auVar164._0_4_;
      auVar349._4_4_ = fVar204 * auVar201._20_4_ + fVar231 * auVar164._4_4_;
      auVar349._8_4_ = fVar205 * auVar201._24_4_ + fVar89 * auVar164._8_4_;
      auVar349._12_4_ = fVar229 * auVar201._28_4_ + fVar115 * auVar164._12_4_;
      auVar164 = vshufps_avx(auVar371,auVar371,0xe8);
      auVar22 = vshufps_avx(auVar349,auVar349,0xe8);
      auVar134 = vcmpps_avx(auVar164,auVar22,1);
      uVar80 = vextractps_avx(auVar134,0);
      auVar92 = auVar349;
      if ((uVar80 & 1) == 0) {
        auVar92 = auVar371;
      }
      auVar106 = vmaxss_avx(auVar92,auVar106);
      auVar126 = vminps_avx(auVar126,auVar193);
      auVar193 = vminps_avx(auVar164,auVar22);
      auVar193 = vminps_avx(auVar126,auVar193);
      auVar135 = vshufps_avx(auVar135,auVar135,0x55);
      auVar135 = vblendps_avx(auVar135,auVar134,2);
      auVar134 = vpslld_avx(auVar135,0x1f);
      auVar135 = vshufpd_avx(auVar302,auVar302,1);
      auVar135 = vinsertps_avx(auVar135,auVar349,0x9c);
      auVar126 = vshufpd_avx(auVar288,auVar288,1);
      auVar126 = vinsertps_avx(auVar126,auVar371,0x9c);
      auVar135 = vblendvps_avx(auVar126,auVar135,auVar134);
      auVar126 = vmovshdup_avx(auVar135);
      auVar135 = vmaxss_avx(auVar126,auVar135);
      fVar205 = auVar193._0_4_;
      auVar126 = vmovshdup_avx(auVar193);
      fVar204 = auVar135._0_4_;
      fVar229 = auVar126._0_4_;
      fVar203 = auVar106._0_4_;
      if ((0.0001 <= fVar205) || (fVar204 <= -0.0001)) {
        if ((-0.0001 < fVar203 && fVar229 < 0.0001) ||
           ((fVar205 < 0.0001 && -0.0001 < fVar203 || (fVar229 < 0.0001 && -0.0001 < fVar204))))
        goto LAB_01004e88;
LAB_01005a90:
        bVar59 = true;
        auVar374 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
LAB_01004e88:
        auVar374 = ZEXT464(0) << 0x20;
        auVar134 = vcmpps_avx(auVar193,ZEXT416(0) << 0x20,1);
        auVar126 = vcmpss_avx(auVar106,ZEXT416(0),1);
        auVar363._8_4_ = 0x3f800000;
        auVar363._0_8_ = &DAT_3f8000003f800000;
        auVar363._12_4_ = 0x3f800000;
        auVar243._8_4_ = 0xbf800000;
        auVar243._0_8_ = 0xbf800000bf800000;
        auVar243._12_4_ = 0xbf800000;
        auVar126 = vblendvps_avx(auVar363,auVar243,auVar126);
        auVar134 = vblendvps_avx(auVar363,auVar243,auVar134);
        auVar164 = vcmpss_avx(auVar126,auVar134,4);
        auVar164 = vpshufd_avx(ZEXT416(auVar164._0_4_ & 1),0x50);
        auVar164 = vpslld_avx(auVar164,0x1f);
        auVar164 = vpsrad_avx(auVar164,0x1f);
        auVar164 = vpandn_avx(auVar164,_DAT_02020eb0);
        auVar22 = vmovshdup_avx(auVar134);
        fVar230 = auVar22._0_4_;
        if ((auVar134._0_4_ != fVar230) || (NAN(auVar134._0_4_) || NAN(fVar230))) {
          if ((fVar229 != fVar205) || (NAN(fVar229) || NAN(fVar205))) {
            fVar205 = -fVar205 / (fVar229 - fVar205);
            auVar134 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar205) * 0.0 + fVar205)));
          }
          else {
            auVar134 = vcmpss_avx(auVar193,ZEXT416(0),0);
            auVar134 = vpshufd_avx(ZEXT416(auVar134._0_4_ & 1),0x50);
            auVar134 = vpslld_avx(auVar134,0x1f);
            auVar134 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar134);
          }
          auVar22 = vcmpps_avx(auVar164,auVar134,1);
          auVar193 = vblendps_avx(auVar164,auVar134,2);
          auVar134 = vblendps_avx(auVar134,auVar164,2);
          auVar164 = vblendvps_avx(auVar134,auVar193,auVar22);
        }
        auVar135 = vcmpss_avx(auVar135,ZEXT416(0),1);
        auVar165._8_4_ = 0xbf800000;
        auVar165._0_8_ = 0xbf800000bf800000;
        auVar165._12_4_ = 0xbf800000;
        auVar135 = vblendvps_avx(auVar363,auVar165,auVar135);
        fVar205 = auVar135._0_4_;
        if ((auVar126._0_4_ != fVar205) || (NAN(auVar126._0_4_) || NAN(fVar205))) {
          if ((fVar204 != fVar203) || (NAN(fVar204) || NAN(fVar203))) {
            fVar203 = -fVar203 / (fVar204 - fVar203);
            auVar135 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar203) * 0.0 + fVar203)));
          }
          else {
            auVar135 = vcmpss_avx(auVar106,ZEXT416(0),0);
            auVar135 = vpshufd_avx(ZEXT416(auVar135._0_4_ & 1),0x50);
            auVar135 = vpslld_avx(auVar135,0x1f);
            auVar135 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar135);
          }
          auVar134 = vcmpps_avx(auVar164,auVar135,1);
          auVar126 = vblendps_avx(auVar164,auVar135,2);
          auVar135 = vblendps_avx(auVar135,auVar164,2);
          auVar164 = vblendvps_avx(auVar135,auVar126,auVar134);
        }
        if ((fVar230 != fVar205) || (NAN(fVar230) || NAN(fVar205))) {
          auVar135 = vcmpps_avx(auVar164,auVar363,1);
          auVar126 = vinsertps_avx(auVar164,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar244._4_12_ = auVar164._4_12_;
          auVar244._0_4_ = 0x3f800000;
          auVar164 = vblendvps_avx(auVar244,auVar126,auVar135);
        }
        auVar135 = vcmpps_avx(auVar164,_DAT_01fec6f0,1);
        auVar62._12_4_ = 0;
        auVar62._0_12_ = auVar164._4_12_;
        auVar126 = vinsertps_avx(auVar164,ZEXT416(0x3f800000),0x10);
        auVar135 = vblendvps_avx(auVar126,auVar62 << 0x20,auVar135);
        auVar126 = vmovshdup_avx(auVar135);
        bVar59 = true;
        if (auVar135._0_4_ <= auVar126._0_4_) {
          auVar136._0_4_ = auVar135._0_4_ + -0.1;
          auVar136._4_4_ = auVar135._4_4_ + 0.1;
          auVar136._8_4_ = auVar135._8_4_ + 0.0;
          auVar136._12_4_ = auVar135._12_4_ + 0.0;
          auVar134 = vshufpd_avx(auVar301,auVar301,3);
          auVar189._8_8_ = 0x3f80000000000000;
          auVar189._0_8_ = 0x3f80000000000000;
          auVar135 = vcmpps_avx(auVar136,auVar189,1);
          auVar63._12_4_ = 0;
          auVar63._0_12_ = auVar136._4_12_;
          auVar126 = vinsertps_avx(auVar136,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar135 = vblendvps_avx(auVar126,auVar63 << 0x20,auVar135);
          auVar126 = vshufpd_avx(auVar91,auVar91,3);
          auVar193 = vshufps_avx(auVar135,auVar135,0x50);
          auVar106 = vsubps_avx(auVar363,auVar193);
          local_660 = auVar249._0_4_;
          fStack_65c = auVar249._4_4_;
          fStack_658 = auVar249._8_4_;
          fStack_654 = auVar249._12_4_;
          fVar203 = auVar193._0_4_;
          fVar204 = auVar193._4_4_;
          fVar205 = auVar193._8_4_;
          fVar229 = auVar193._12_4_;
          local_6a0 = auVar194._0_4_;
          fStack_69c = auVar194._4_4_;
          fStack_698 = auVar194._8_4_;
          fStack_694 = auVar194._12_4_;
          fVar230 = auVar106._0_4_;
          fVar231 = auVar106._4_4_;
          fVar89 = auVar106._8_4_;
          fVar115 = auVar106._12_4_;
          auVar166._0_4_ = fVar203 * local_660 + fVar230 * auVar188._0_4_;
          auVar166._4_4_ = fVar204 * fStack_65c + fVar231 * auVar188._4_4_;
          auVar166._8_4_ = fVar205 * fStack_658 + fVar89 * auVar188._0_4_;
          auVar166._12_4_ = fVar229 * fStack_654 + fVar115 * auVar188._4_4_;
          auVar220._0_4_ = fVar203 * auVar134._0_4_ + fVar230 * auVar301._0_4_;
          auVar220._4_4_ = fVar204 * auVar134._4_4_ + fVar231 * auVar301._4_4_;
          auVar220._8_4_ = fVar205 * auVar134._8_4_ + fVar89 * auVar301._0_4_;
          auVar220._12_4_ = fVar229 * auVar134._12_4_ + fVar115 * auVar301._4_4_;
          auVar274._0_4_ = fVar203 * auVar126._0_4_ + fVar230 * fVar202;
          auVar274._4_4_ = fVar204 * auVar126._4_4_ + fVar231 * fVar116;
          auVar274._8_4_ = fVar205 * auVar126._8_4_ + fVar89 * fVar202;
          auVar274._12_4_ = fVar229 * auVar126._12_4_ + fVar115 * fVar116;
          auVar289._0_4_ = fVar203 * local_6a0 + fVar230 * auVar201._16_4_;
          auVar289._4_4_ = fVar204 * fStack_69c + fVar231 * auVar201._20_4_;
          auVar289._8_4_ = fVar205 * fStack_698 + fVar89 * auVar201._16_4_;
          auVar289._12_4_ = fVar229 * fStack_694 + fVar115 * auVar201._20_4_;
          auVar194 = vsubps_avx(auVar363,auVar135);
          auVar126 = vmovshdup_avx(_local_6d0);
          auVar249 = vmovsldup_avx(_local_6d0);
          local_6d0._0_4_ = auVar194._0_4_ * auVar249._0_4_ + auVar126._0_4_ * auVar135._0_4_;
          local_6d0._4_4_ = auVar194._4_4_ * auVar249._4_4_ + auVar126._4_4_ * auVar135._4_4_;
          fStack_6c8 = auVar194._8_4_ * auVar249._8_4_ + auVar126._8_4_ * auVar135._8_4_;
          fStack_6c4 = auVar194._12_4_ * auVar249._12_4_ + auVar126._12_4_ * auVar135._12_4_;
          auVar91 = vmovshdup_avx(_local_6d0);
          auVar135 = vsubps_avx(auVar220,auVar166);
          auVar245._0_4_ = auVar135._0_4_ * 3.0;
          auVar245._4_4_ = auVar135._4_4_ * 3.0;
          auVar245._8_4_ = auVar135._8_4_ * 3.0;
          auVar245._12_4_ = auVar135._12_4_ * 3.0;
          auVar135 = vsubps_avx(auVar274,auVar220);
          auVar260._0_4_ = auVar135._0_4_ * 3.0;
          auVar260._4_4_ = auVar135._4_4_ * 3.0;
          auVar260._8_4_ = auVar135._8_4_ * 3.0;
          auVar260._12_4_ = auVar135._12_4_ * 3.0;
          auVar135 = vsubps_avx(auVar289,auVar274);
          auVar303._0_4_ = auVar135._0_4_ * 3.0;
          auVar303._4_4_ = auVar135._4_4_ * 3.0;
          auVar303._8_4_ = auVar135._8_4_ * 3.0;
          auVar303._12_4_ = auVar135._12_4_ * 3.0;
          auVar126 = vminps_avx(auVar260,auVar303);
          auVar135 = vmaxps_avx(auVar260,auVar303);
          auVar126 = vminps_avx(auVar245,auVar126);
          auVar135 = vmaxps_avx(auVar245,auVar135);
          auVar249 = vshufpd_avx(auVar126,auVar126,3);
          auVar194 = vshufpd_avx(auVar135,auVar135,3);
          auVar126 = vminps_avx(auVar126,auVar249);
          auVar135 = vmaxps_avx(auVar135,auVar194);
          auVar249 = vshufps_avx(ZEXT416((uint)(1.0 / fVar176)),ZEXT416((uint)(1.0 / fVar176)),0);
          auVar246._0_4_ = auVar249._0_4_ * auVar126._0_4_;
          auVar246._4_4_ = auVar249._4_4_ * auVar126._4_4_;
          auVar246._8_4_ = auVar249._8_4_ * auVar126._8_4_;
          auVar246._12_4_ = auVar249._12_4_ * auVar126._12_4_;
          auVar261._0_4_ = auVar135._0_4_ * auVar249._0_4_;
          auVar261._4_4_ = auVar135._4_4_ * auVar249._4_4_;
          auVar261._8_4_ = auVar135._8_4_ * auVar249._8_4_;
          auVar261._12_4_ = auVar135._12_4_ * auVar249._12_4_;
          auVar106 = ZEXT416((uint)(1.0 / (auVar91._0_4_ - (float)local_6d0._0_4_)));
          auVar135 = vshufpd_avx(auVar166,auVar166,3);
          auVar126 = vshufpd_avx(auVar220,auVar220,3);
          auVar249 = vshufpd_avx(auVar274,auVar274,3);
          auVar194 = vshufpd_avx(auVar289,auVar289,3);
          auVar135 = vsubps_avx(auVar135,auVar166);
          auVar134 = vsubps_avx(auVar126,auVar220);
          auVar193 = vsubps_avx(auVar249,auVar274);
          auVar194 = vsubps_avx(auVar194,auVar289);
          auVar126 = vminps_avx(auVar135,auVar134);
          auVar135 = vmaxps_avx(auVar135,auVar134);
          auVar249 = vminps_avx(auVar193,auVar194);
          auVar249 = vminps_avx(auVar126,auVar249);
          auVar126 = vmaxps_avx(auVar193,auVar194);
          auVar135 = vmaxps_avx(auVar135,auVar126);
          auVar126 = vshufps_avx(auVar106,auVar106,0);
          auVar316._0_4_ = auVar126._0_4_ * auVar249._0_4_;
          auVar316._4_4_ = auVar126._4_4_ * auVar249._4_4_;
          auVar316._8_4_ = auVar126._8_4_ * auVar249._8_4_;
          auVar316._12_4_ = auVar126._12_4_ * auVar249._12_4_;
          auVar324._0_4_ = auVar126._0_4_ * auVar135._0_4_;
          auVar324._4_4_ = auVar126._4_4_ * auVar135._4_4_;
          auVar324._8_4_ = auVar126._8_4_ * auVar135._8_4_;
          auVar324._12_4_ = auVar126._12_4_ * auVar135._12_4_;
          auVar135 = vmovsldup_avx(_local_6d0);
          auVar275._4_12_ = auVar135._4_12_;
          auVar275._0_4_ = fVar177;
          auVar290._4_12_ = local_6d0._4_12_;
          auVar290._0_4_ = fVar175;
          auVar107._0_4_ = (fVar175 + fVar177) * 0.5;
          auVar107._4_4_ = ((float)local_6d0._4_4_ + auVar135._4_4_) * 0.5;
          auVar107._8_4_ = (fStack_6c8 + auVar135._8_4_) * 0.5;
          auVar107._12_4_ = (fStack_6c4 + auVar135._12_4_) * 0.5;
          auVar135 = vshufps_avx(auVar107,auVar107,0);
          fVar202 = auVar135._0_4_;
          fVar203 = auVar135._4_4_;
          fVar204 = auVar135._8_4_;
          fVar205 = auVar135._12_4_;
          local_5d0 = auVar19._0_4_;
          fStack_5cc = auVar19._4_4_;
          fStack_5c8 = auVar19._8_4_;
          fStack_5c4 = auVar19._12_4_;
          auVar221._0_4_ = fVar202 * (float)local_330._0_4_ + local_5d0;
          auVar221._4_4_ = fVar203 * (float)local_330._4_4_ + fStack_5cc;
          auVar221._8_4_ = fVar204 * fStack_328 + fStack_5c8;
          auVar221._12_4_ = fVar205 * fStack_324 + fStack_5c4;
          local_5e0 = auVar20._0_4_;
          fStack_5dc = auVar20._4_4_;
          fStack_5d8 = auVar20._8_4_;
          fStack_5d4 = auVar20._12_4_;
          auVar304._0_4_ = fVar202 * (float)local_340._0_4_ + local_5e0;
          auVar304._4_4_ = fVar203 * (float)local_340._4_4_ + fStack_5dc;
          auVar304._8_4_ = fVar204 * fStack_338 + fStack_5d8;
          auVar304._12_4_ = fVar205 * fStack_334 + fStack_5d4;
          local_5f0 = auVar21._0_4_;
          fStack_5ec = auVar21._4_4_;
          fStack_5e8 = auVar21._8_4_;
          fStack_5e4 = auVar21._12_4_;
          auVar338._0_4_ = fVar202 * (float)local_350._0_4_ + local_5f0;
          auVar338._4_4_ = fVar203 * (float)local_350._4_4_ + fStack_5ec;
          auVar338._8_4_ = fVar204 * fStack_348 + fStack_5e8;
          auVar338._12_4_ = fVar205 * fStack_344 + fStack_5e4;
          auVar135 = vsubps_avx(auVar304,auVar221);
          auVar222._0_4_ = auVar135._0_4_ * fVar202 + auVar221._0_4_;
          auVar222._4_4_ = auVar135._4_4_ * fVar203 + auVar221._4_4_;
          auVar222._8_4_ = auVar135._8_4_ * fVar204 + auVar221._8_4_;
          auVar222._12_4_ = auVar135._12_4_ * fVar205 + auVar221._12_4_;
          auVar135 = vsubps_avx(auVar338,auVar304);
          auVar305._0_4_ = auVar304._0_4_ + auVar135._0_4_ * fVar202;
          auVar305._4_4_ = auVar304._4_4_ + auVar135._4_4_ * fVar203;
          auVar305._8_4_ = auVar304._8_4_ + auVar135._8_4_ * fVar204;
          auVar305._12_4_ = auVar304._12_4_ + auVar135._12_4_ * fVar205;
          auVar135 = vsubps_avx(auVar305,auVar222);
          fVar202 = auVar222._0_4_ + auVar135._0_4_ * fVar202;
          fVar203 = auVar222._4_4_ + auVar135._4_4_ * fVar203;
          auVar167._0_8_ = CONCAT44(fVar203,fVar202);
          auVar167._8_4_ = auVar222._8_4_ + auVar135._8_4_ * fVar204;
          auVar167._12_4_ = auVar222._12_4_ + auVar135._12_4_ * fVar205;
          fVar204 = auVar135._0_4_ * 3.0;
          fVar205 = auVar135._4_4_ * 3.0;
          auVar223._0_8_ = CONCAT44(fVar205,fVar204);
          auVar223._8_4_ = auVar135._8_4_ * 3.0;
          auVar223._12_4_ = auVar135._12_4_ * 3.0;
          auVar306._8_8_ = auVar167._0_8_;
          auVar306._0_8_ = auVar167._0_8_;
          auVar135 = vshufpd_avx(auVar167,auVar167,3);
          auVar126 = vshufps_avx(auVar107,auVar107,0x55);
          auVar193 = vsubps_avx(auVar135,auVar306);
          auVar307._0_4_ = auVar126._0_4_ * auVar193._0_4_ + fVar202;
          auVar307._4_4_ = auVar126._4_4_ * auVar193._4_4_ + fVar203;
          auVar307._8_4_ = auVar126._8_4_ * auVar193._8_4_ + fVar202;
          auVar307._12_4_ = auVar126._12_4_ * auVar193._12_4_ + fVar203;
          auVar350._8_8_ = auVar223._0_8_;
          auVar350._0_8_ = auVar223._0_8_;
          auVar135 = vshufpd_avx(auVar223,auVar223,1);
          auVar135 = vsubps_avx(auVar135,auVar350);
          auVar224._0_4_ = fVar204 + auVar126._0_4_ * auVar135._0_4_;
          auVar224._4_4_ = fVar205 + auVar126._4_4_ * auVar135._4_4_;
          auVar224._8_4_ = fVar204 + auVar126._8_4_ * auVar135._8_4_;
          auVar224._12_4_ = fVar205 + auVar126._12_4_ * auVar135._12_4_;
          auVar126 = vmovshdup_avx(auVar224);
          auVar351._0_8_ = auVar126._0_8_ ^ 0x8000000080000000;
          auVar351._8_4_ = auVar126._8_4_ ^ 0x80000000;
          auVar351._12_4_ = auVar126._12_4_ ^ 0x80000000;
          auVar249 = vmovshdup_avx(auVar193);
          auVar135 = vunpcklps_avx(auVar249,auVar351);
          auVar194 = vshufps_avx(auVar135,auVar351,4);
          auVar168._0_8_ = auVar193._0_8_ ^ 0x8000000080000000;
          auVar168._8_4_ = -auVar193._8_4_;
          auVar168._12_4_ = -auVar193._12_4_;
          auVar135 = vmovlhps_avx(auVar168,auVar224);
          auVar134 = vshufps_avx(auVar135,auVar224,8);
          auVar135 = ZEXT416((uint)(auVar249._0_4_ * auVar224._0_4_ -
                                   auVar126._0_4_ * auVar193._0_4_));
          auVar126 = vshufps_avx(auVar135,auVar135,0);
          auVar135 = vdivps_avx(auVar194,auVar126);
          auVar126 = vdivps_avx(auVar134,auVar126);
          auVar134 = vinsertps_avx(auVar246,auVar316,0x1c);
          auVar193 = vinsertps_avx(auVar261,auVar324,0x1c);
          auVar106 = vinsertps_avx(auVar316,auVar246,0x4c);
          auVar164 = vinsertps_avx(auVar324,auVar261,0x4c);
          auVar249 = vmovsldup_avx(auVar135);
          auVar325._0_4_ = auVar249._0_4_ * auVar134._0_4_;
          auVar325._4_4_ = auVar249._4_4_ * auVar134._4_4_;
          auVar325._8_4_ = auVar249._8_4_ * auVar134._8_4_;
          auVar325._12_4_ = auVar249._12_4_ * auVar134._12_4_;
          auVar317._0_4_ = auVar249._0_4_ * auVar193._0_4_;
          auVar317._4_4_ = auVar249._4_4_ * auVar193._4_4_;
          auVar317._8_4_ = auVar249._8_4_ * auVar193._8_4_;
          auVar317._12_4_ = auVar249._12_4_ * auVar193._12_4_;
          auVar194 = vminps_avx(auVar325,auVar317);
          auVar249 = vmaxps_avx(auVar317,auVar325);
          auVar22 = vmovsldup_avx(auVar126);
          auVar372._0_4_ = auVar22._0_4_ * auVar106._0_4_;
          auVar372._4_4_ = auVar22._4_4_ * auVar106._4_4_;
          auVar372._8_4_ = auVar22._8_4_ * auVar106._8_4_;
          auVar372._12_4_ = auVar22._12_4_ * auVar106._12_4_;
          auVar318._0_4_ = auVar22._0_4_ * auVar164._0_4_;
          auVar318._4_4_ = auVar22._4_4_ * auVar164._4_4_;
          auVar318._8_4_ = auVar22._8_4_ * auVar164._8_4_;
          auVar318._12_4_ = auVar22._12_4_ * auVar164._12_4_;
          auVar22 = vminps_avx(auVar372,auVar318);
          auVar137._0_4_ = auVar194._0_4_ + auVar22._0_4_;
          auVar137._4_4_ = auVar194._4_4_ + auVar22._4_4_;
          auVar137._8_4_ = auVar194._8_4_ + auVar22._8_4_;
          auVar137._12_4_ = auVar194._12_4_ + auVar22._12_4_;
          auVar194 = vmaxps_avx(auVar318,auVar372);
          auVar22 = vsubps_avx(auVar275,auVar107);
          auVar92 = vsubps_avx(auVar290,auVar107);
          auVar291._0_4_ = auVar249._0_4_ + auVar194._0_4_;
          auVar291._4_4_ = auVar249._4_4_ + auVar194._4_4_;
          auVar291._8_4_ = auVar249._8_4_ + auVar194._8_4_;
          auVar291._12_4_ = auVar249._12_4_ + auVar194._12_4_;
          auVar326._8_8_ = 0x3f800000;
          auVar326._0_8_ = 0x3f800000;
          auVar249 = vsubps_avx(auVar326,auVar291);
          auVar194 = vsubps_avx(auVar326,auVar137);
          fVar231 = auVar22._0_4_;
          auVar327._0_4_ = fVar231 * auVar249._0_4_;
          fVar89 = auVar22._4_4_;
          auVar327._4_4_ = fVar89 * auVar249._4_4_;
          fVar115 = auVar22._8_4_;
          auVar327._8_4_ = fVar115 * auVar249._8_4_;
          fVar116 = auVar22._12_4_;
          auVar327._12_4_ = fVar116 * auVar249._12_4_;
          fVar204 = auVar92._0_4_;
          auVar292._0_4_ = auVar249._0_4_ * fVar204;
          fVar205 = auVar92._4_4_;
          auVar292._4_4_ = auVar249._4_4_ * fVar205;
          fVar229 = auVar92._8_4_;
          auVar292._8_4_ = auVar249._8_4_ * fVar229;
          fVar230 = auVar92._12_4_;
          auVar292._12_4_ = auVar249._12_4_ * fVar230;
          auVar364._0_4_ = fVar231 * auVar194._0_4_;
          auVar364._4_4_ = fVar89 * auVar194._4_4_;
          auVar364._8_4_ = fVar115 * auVar194._8_4_;
          auVar364._12_4_ = fVar116 * auVar194._12_4_;
          auVar138._0_4_ = fVar204 * auVar194._0_4_;
          auVar138._4_4_ = fVar205 * auVar194._4_4_;
          auVar138._8_4_ = fVar229 * auVar194._8_4_;
          auVar138._12_4_ = fVar230 * auVar194._12_4_;
          auVar249 = vminps_avx(auVar327,auVar364);
          auVar194 = vminps_avx(auVar292,auVar138);
          auVar22 = vminps_avx(auVar249,auVar194);
          auVar249 = vmaxps_avx(auVar364,auVar327);
          auVar194 = vmaxps_avx(auVar138,auVar292);
          auVar92 = vshufps_avx(auVar107,auVar107,0x54);
          auVar194 = vmaxps_avx(auVar194,auVar249);
          auVar102 = vshufps_avx(auVar307,auVar307,0);
          auVar119 = vshufps_avx(auVar307,auVar307,0x55);
          auVar249 = vhaddps_avx(auVar22,auVar22);
          auVar194 = vhaddps_avx(auVar194,auVar194);
          auVar293._0_4_ = auVar102._0_4_ * auVar135._0_4_ + auVar119._0_4_ * auVar126._0_4_;
          auVar293._4_4_ = auVar102._4_4_ * auVar135._4_4_ + auVar119._4_4_ * auVar126._4_4_;
          auVar293._8_4_ = auVar102._8_4_ * auVar135._8_4_ + auVar119._8_4_ * auVar126._8_4_;
          auVar293._12_4_ = auVar102._12_4_ * auVar135._12_4_ + auVar119._12_4_ * auVar126._12_4_;
          auVar22 = vsubps_avx(auVar92,auVar293);
          fVar202 = auVar22._0_4_ + auVar249._0_4_;
          fVar203 = auVar22._0_4_ + auVar194._0_4_;
          auVar249 = vmaxss_avx(ZEXT416((uint)fVar177),ZEXT416((uint)fVar202));
          auVar194 = vminss_avx(ZEXT416((uint)fVar203),ZEXT416((uint)fVar175));
          if (auVar249._0_4_ <= auVar194._0_4_) {
            auVar249 = vmovshdup_avx(auVar135);
            auVar190._0_4_ = auVar134._0_4_ * auVar249._0_4_;
            auVar190._4_4_ = auVar134._4_4_ * auVar249._4_4_;
            auVar190._8_4_ = auVar134._8_4_ * auVar249._8_4_;
            auVar190._12_4_ = auVar134._12_4_ * auVar249._12_4_;
            auVar139._0_4_ = auVar193._0_4_ * auVar249._0_4_;
            auVar139._4_4_ = auVar193._4_4_ * auVar249._4_4_;
            auVar139._8_4_ = auVar193._8_4_ * auVar249._8_4_;
            auVar139._12_4_ = auVar193._12_4_ * auVar249._12_4_;
            auVar194 = vminps_avx(auVar190,auVar139);
            auVar249 = vmaxps_avx(auVar139,auVar190);
            auVar134 = vmovshdup_avx(auVar126);
            auVar247._0_4_ = auVar134._0_4_ * auVar106._0_4_;
            auVar247._4_4_ = auVar134._4_4_ * auVar106._4_4_;
            auVar247._8_4_ = auVar134._8_4_ * auVar106._8_4_;
            auVar247._12_4_ = auVar134._12_4_ * auVar106._12_4_;
            auVar191._0_4_ = auVar134._0_4_ * auVar164._0_4_;
            auVar191._4_4_ = auVar134._4_4_ * auVar164._4_4_;
            auVar191._8_4_ = auVar134._8_4_ * auVar164._8_4_;
            auVar191._12_4_ = auVar134._12_4_ * auVar164._12_4_;
            auVar134 = vminps_avx(auVar247,auVar191);
            auVar262._0_4_ = auVar194._0_4_ + auVar134._0_4_;
            auVar262._4_4_ = auVar194._4_4_ + auVar134._4_4_;
            auVar262._8_4_ = auVar194._8_4_ + auVar134._8_4_;
            auVar262._12_4_ = auVar194._12_4_ + auVar134._12_4_;
            auVar194 = vmaxps_avx(auVar191,auVar247);
            auVar140._0_4_ = auVar249._0_4_ + auVar194._0_4_;
            auVar140._4_4_ = auVar249._4_4_ + auVar194._4_4_;
            auVar140._8_4_ = auVar249._8_4_ + auVar194._8_4_;
            auVar140._12_4_ = auVar249._12_4_ + auVar194._12_4_;
            auVar249 = vsubps_avx(auVar189,auVar140);
            auVar194 = vsubps_avx(auVar189,auVar262);
            auVar248._0_4_ = fVar231 * auVar249._0_4_;
            auVar248._4_4_ = fVar89 * auVar249._4_4_;
            auVar248._8_4_ = fVar115 * auVar249._8_4_;
            auVar248._12_4_ = fVar116 * auVar249._12_4_;
            auVar263._0_4_ = fVar231 * auVar194._0_4_;
            auVar263._4_4_ = fVar89 * auVar194._4_4_;
            auVar263._8_4_ = fVar115 * auVar194._8_4_;
            auVar263._12_4_ = fVar116 * auVar194._12_4_;
            auVar141._0_4_ = fVar204 * auVar249._0_4_;
            auVar141._4_4_ = fVar205 * auVar249._4_4_;
            auVar141._8_4_ = fVar229 * auVar249._8_4_;
            auVar141._12_4_ = fVar230 * auVar249._12_4_;
            auVar192._0_4_ = fVar204 * auVar194._0_4_;
            auVar192._4_4_ = fVar205 * auVar194._4_4_;
            auVar192._8_4_ = fVar229 * auVar194._8_4_;
            auVar192._12_4_ = fVar230 * auVar194._12_4_;
            auVar249 = vminps_avx(auVar248,auVar263);
            auVar194 = vminps_avx(auVar141,auVar192);
            auVar249 = vminps_avx(auVar249,auVar194);
            auVar194 = vmaxps_avx(auVar263,auVar248);
            auVar134 = vmaxps_avx(auVar192,auVar141);
            auVar249 = vhaddps_avx(auVar249,auVar249);
            auVar194 = vmaxps_avx(auVar134,auVar194);
            auVar194 = vhaddps_avx(auVar194,auVar194);
            auVar134 = vmovshdup_avx(auVar22);
            auVar193 = ZEXT416((uint)(auVar134._0_4_ + auVar249._0_4_));
            auVar249 = vmaxss_avx(_local_6d0,auVar193);
            auVar134 = ZEXT416((uint)(auVar134._0_4_ + auVar194._0_4_));
            auVar194 = vminss_avx(auVar134,auVar91);
            auVar365._8_4_ = 0x7fffffff;
            auVar365._0_8_ = 0x7fffffff7fffffff;
            auVar365._12_4_ = 0x7fffffff;
            if (auVar249._0_4_ <= auVar194._0_4_) {
              uVar80 = 0;
              auVar374 = ZEXT864(0) << 0x20;
              if ((fVar177 < fVar202) && (fVar203 < fVar175)) {
                auVar249 = vcmpps_avx(auVar134,auVar91,1);
                auVar194 = vcmpps_avx(_local_6d0,auVar193,1);
                auVar249 = vandps_avx(auVar194,auVar249);
                uVar80 = auVar249._0_4_;
              }
              if (((uint)uVar85 < 4 && 0.001 <= fVar176) && (uVar80 & 1) == 0) {
                bVar59 = false;
              }
              else {
                lVar83 = 200;
                do {
                  fVar202 = auVar22._0_4_;
                  fVar176 = 1.0 - fVar202;
                  auVar249 = ZEXT416((uint)(fVar176 * fVar176 * fVar176));
                  auVar249 = vshufps_avx(auVar249,auVar249,0);
                  auVar194 = ZEXT416((uint)(fVar202 * 3.0 * fVar176 * fVar176));
                  auVar194 = vshufps_avx(auVar194,auVar194,0);
                  auVar134 = ZEXT416((uint)(fVar176 * fVar202 * fVar202 * 3.0));
                  auVar134 = vshufps_avx(auVar134,auVar134,0);
                  auVar193 = ZEXT416((uint)(fVar202 * fVar202 * fVar202));
                  auVar193 = vshufps_avx(auVar193,auVar193,0);
                  fVar176 = local_5d0 * auVar249._0_4_ +
                            local_5e0 * auVar194._0_4_ +
                            (float)local_490._0_4_ * auVar193._0_4_ + local_5f0 * auVar134._0_4_;
                  fVar202 = fStack_5cc * auVar249._4_4_ +
                            fStack_5dc * auVar194._4_4_ +
                            (float)local_490._4_4_ * auVar193._4_4_ + fStack_5ec * auVar134._4_4_;
                  auVar142._0_8_ = CONCAT44(fVar202,fVar176);
                  auVar142._8_4_ =
                       fStack_5c8 * auVar249._8_4_ +
                       fStack_5d8 * auVar194._8_4_ +
                       fStack_488 * auVar193._8_4_ + fStack_5e8 * auVar134._8_4_;
                  auVar142._12_4_ =
                       fStack_5c4 * auVar249._12_4_ +
                       fStack_5d4 * auVar194._12_4_ +
                       fStack_484 * auVar193._12_4_ + fStack_5e4 * auVar134._12_4_;
                  auVar195._8_8_ = auVar142._0_8_;
                  auVar195._0_8_ = auVar142._0_8_;
                  auVar194 = vshufpd_avx(auVar142,auVar142,1);
                  auVar249 = vmovshdup_avx(auVar22);
                  auVar194 = vsubps_avx(auVar194,auVar195);
                  auVar143._0_4_ = auVar249._0_4_ * auVar194._0_4_ + fVar176;
                  auVar143._4_4_ = auVar249._4_4_ * auVar194._4_4_ + fVar202;
                  auVar143._8_4_ = auVar249._8_4_ * auVar194._8_4_ + fVar176;
                  auVar143._12_4_ = auVar249._12_4_ * auVar194._12_4_ + fVar202;
                  auVar249 = vshufps_avx(auVar143,auVar143,0);
                  auVar194 = vshufps_avx(auVar143,auVar143,0x55);
                  auVar196._0_4_ = auVar135._0_4_ * auVar249._0_4_ + auVar126._0_4_ * auVar194._0_4_
                  ;
                  auVar196._4_4_ = auVar135._4_4_ * auVar249._4_4_ + auVar126._4_4_ * auVar194._4_4_
                  ;
                  auVar196._8_4_ = auVar135._8_4_ * auVar249._8_4_ + auVar126._8_4_ * auVar194._8_4_
                  ;
                  auVar196._12_4_ =
                       auVar135._12_4_ * auVar249._12_4_ + auVar126._12_4_ * auVar194._12_4_;
                  auVar22 = vsubps_avx(auVar22,auVar196);
                  auVar249 = vandps_avx(auVar365,auVar143);
                  auVar194 = vshufps_avx(auVar249,auVar249,0xf5);
                  auVar249 = vmaxss_avx(auVar194,auVar249);
                  if (auVar249._0_4_ < fVar150) {
                    fVar176 = auVar22._0_4_;
                    if ((0.0 <= fVar176) && (fVar176 <= 1.0)) {
                      auVar135 = vmovshdup_avx(auVar22);
                      fVar202 = auVar135._0_4_;
                      if ((0.0 <= fVar202) && (fVar202 <= 1.0)) {
                        auVar135 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2])
                                                 ,ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]
                                                         ),0x1c);
                        auVar164 = vinsertps_avx(auVar135,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                        auVar135 = vdpps_avx(auVar164,local_360,0x7f);
                        auVar126 = vdpps_avx(auVar164,local_370,0x7f);
                        auVar249 = vdpps_avx(auVar164,local_3a0,0x7f);
                        auVar194 = vdpps_avx(auVar164,local_3b0,0x7f);
                        auVar134 = vdpps_avx(auVar164,local_3c0,0x7f);
                        auVar193 = vdpps_avx(auVar164,local_3d0,0x7f);
                        fVar230 = 1.0 - fVar202;
                        auVar106 = vdpps_avx(auVar164,local_380,0x7f);
                        auVar164 = vdpps_avx(auVar164,local_390,0x7f);
                        fVar231 = 1.0 - fVar176;
                        fVar203 = auVar22._4_4_;
                        fVar204 = auVar22._8_4_;
                        fVar205 = auVar22._12_4_;
                        fVar229 = fVar231 * fVar176 * fVar176 * 3.0;
                        auVar250._0_4_ = fVar176 * fVar176 * fVar176;
                        auVar250._4_4_ = fVar203 * fVar203 * fVar203;
                        auVar250._8_4_ = fVar204 * fVar204 * fVar204;
                        auVar250._12_4_ = fVar205 * fVar205 * fVar205;
                        fVar203 = fVar176 * 3.0 * fVar231 * fVar231;
                        fVar204 = fVar231 * fVar231 * fVar231;
                        fVar176 = (fVar230 * auVar135._0_4_ + fVar202 * auVar249._0_4_) * fVar204 +
                                  (fVar230 * auVar126._0_4_ + fVar202 * auVar194._0_4_) * fVar203 +
                                  fVar229 * (fVar230 * auVar106._0_4_ + fVar202 * auVar134._0_4_) +
                                  auVar250._0_4_ *
                                  (auVar193._0_4_ * fVar202 + fVar230 * auVar164._0_4_);
                        if ((fVar90 <= fVar176) &&
                           (fVar202 = *(float *)(ray + k * 4 + 0x100), fVar176 <= fVar202)) {
                          pGVar13 = (context->scene->geometries).items[uVar79].ptr;
                          if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                            bVar88 = false;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar88 = true,
                                  pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            local_f0 = vshufps_avx(auVar22,auVar22,0x55);
                            auVar294._8_4_ = 0x3f800000;
                            auVar294._0_8_ = &DAT_3f8000003f800000;
                            auVar294._12_4_ = 0x3f800000;
                            auVar135 = vsubps_avx(auVar294,local_f0);
                            fVar205 = local_f0._0_4_;
                            fVar230 = local_f0._4_4_;
                            fVar89 = local_f0._8_4_;
                            fVar115 = local_f0._12_4_;
                            fVar116 = auVar135._0_4_;
                            fVar117 = auVar135._4_4_;
                            fVar149 = auVar135._8_4_;
                            fVar298 = auVar135._12_4_;
                            auVar308._0_4_ =
                                 fVar205 * (float)local_4d0._0_4_ + fVar116 * (float)local_4a0._0_4_
                            ;
                            auVar308._4_4_ =
                                 fVar230 * (float)local_4d0._4_4_ + fVar117 * (float)local_4a0._4_4_
                            ;
                            auVar308._8_4_ = fVar89 * fStack_4c8 + fVar149 * fStack_498;
                            auVar308._12_4_ = fVar115 * fStack_4c4 + fVar298 * fStack_494;
                            auVar319._0_4_ = fVar205 * (float)local_4e0._0_4_ + fVar116 * fVar232;
                            auVar319._4_4_ = fVar230 * (float)local_4e0._4_4_ + fVar117 * fVar118;
                            auVar319._8_4_ = fVar89 * fStack_4d8 + fVar149 * fVar147;
                            auVar319._12_4_ = fVar115 * fStack_4d4 + fVar298 * fVar148;
                            auVar328._0_4_ =
                                 fVar205 * (float)local_4f0._0_4_ + fVar116 * (float)local_4b0._0_4_
                            ;
                            auVar328._4_4_ =
                                 fVar230 * (float)local_4f0._4_4_ + fVar117 * (float)local_4b0._4_4_
                            ;
                            auVar328._8_4_ = fVar89 * fStack_4e8 + fVar149 * fStack_4a8;
                            auVar328._12_4_ = fVar115 * fStack_4e4 + fVar298 * fStack_4a4;
                            auVar295._0_4_ = fVar205 * fVar233 + fVar116 * (float)local_4c0._0_4_;
                            auVar295._4_4_ = fVar230 * fVar251 + fVar117 * (float)local_4c0._4_4_;
                            auVar295._8_4_ = fVar89 * fVar252 + fVar149 * fStack_4b8;
                            auVar295._12_4_ = fVar115 * fVar253 + fVar298 * fStack_4b4;
                            auVar194 = vsubps_avx(auVar319,auVar308);
                            auVar134 = vsubps_avx(auVar328,auVar319);
                            auVar193 = vsubps_avx(auVar295,auVar328);
                            local_110 = vshufps_avx(auVar22,auVar22,0);
                            fVar205 = local_110._0_4_;
                            fVar89 = local_110._4_4_;
                            fVar115 = local_110._8_4_;
                            fVar117 = local_110._12_4_;
                            auVar135 = vshufps_avx(ZEXT416((uint)fVar231),ZEXT416((uint)fVar231),0);
                            fVar230 = auVar135._0_4_;
                            fVar231 = auVar135._4_4_;
                            fVar116 = auVar135._8_4_;
                            fVar149 = auVar135._12_4_;
                            auVar135 = vshufps_avx(auVar250,auVar250,0);
                            auVar126 = vshufps_avx(ZEXT416((uint)fVar229),ZEXT416((uint)fVar229),0);
                            auVar249 = vshufps_avx(ZEXT416((uint)fVar203),ZEXT416((uint)fVar203),0);
                            auVar225._0_4_ =
                                 ((auVar134._0_4_ * fVar230 + auVar193._0_4_ * fVar205) * fVar205 +
                                 (auVar194._0_4_ * fVar230 + auVar134._0_4_ * fVar205) * fVar230) *
                                 3.0;
                            auVar225._4_4_ =
                                 ((auVar134._4_4_ * fVar231 + auVar193._4_4_ * fVar89) * fVar89 +
                                 (auVar194._4_4_ * fVar231 + auVar134._4_4_ * fVar89) * fVar231) *
                                 3.0;
                            auVar225._8_4_ =
                                 ((auVar134._8_4_ * fVar116 + auVar193._8_4_ * fVar115) * fVar115 +
                                 (auVar194._8_4_ * fVar116 + auVar134._8_4_ * fVar115) * fVar116) *
                                 3.0;
                            auVar225._12_4_ =
                                 ((auVar134._12_4_ * fVar149 + auVar193._12_4_ * fVar117) * fVar117
                                 + (auVar194._12_4_ * fVar149 + auVar134._12_4_ * fVar117) * fVar149
                                 ) * 3.0;
                            auVar194 = vshufps_avx(ZEXT416((uint)fVar204),ZEXT416((uint)fVar204),0);
                            auVar169._0_4_ =
                                 auVar194._0_4_ * (float)local_400._0_4_ +
                                 auVar249._0_4_ * (float)local_410._0_4_ +
                                 auVar135._0_4_ * (float)local_430._0_4_ +
                                 auVar126._0_4_ * (float)local_420._0_4_;
                            auVar169._4_4_ =
                                 auVar194._4_4_ * (float)local_400._4_4_ +
                                 auVar249._4_4_ * (float)local_410._4_4_ +
                                 auVar135._4_4_ * (float)local_430._4_4_ +
                                 auVar126._4_4_ * (float)local_420._4_4_;
                            auVar169._8_4_ =
                                 auVar194._8_4_ * fStack_3f8 +
                                 auVar249._8_4_ * fStack_408 +
                                 auVar135._8_4_ * fStack_428 + auVar126._8_4_ * fStack_418;
                            auVar169._12_4_ =
                                 auVar194._12_4_ * fStack_3f4 +
                                 auVar249._12_4_ * fStack_404 +
                                 auVar135._12_4_ * fStack_424 + auVar126._12_4_ * fStack_414;
                            auVar135 = vshufps_avx(auVar225,auVar225,0xc9);
                            auVar197._0_4_ = auVar169._0_4_ * auVar135._0_4_;
                            auVar197._4_4_ = auVar169._4_4_ * auVar135._4_4_;
                            auVar197._8_4_ = auVar169._8_4_ * auVar135._8_4_;
                            auVar197._12_4_ = auVar169._12_4_ * auVar135._12_4_;
                            auVar135 = vshufps_avx(auVar169,auVar169,0xc9);
                            auVar170._0_4_ = auVar225._0_4_ * auVar135._0_4_;
                            auVar170._4_4_ = auVar225._4_4_ * auVar135._4_4_;
                            auVar170._8_4_ = auVar225._8_4_ * auVar135._8_4_;
                            auVar170._12_4_ = auVar225._12_4_ * auVar135._12_4_;
                            auVar135 = vsubps_avx(auVar170,auVar197);
                            local_170 = vshufps_avx(auVar135,auVar135,0x55);
                            local_180[0] = (RTCHitN)local_170[0];
                            local_180[1] = (RTCHitN)local_170[1];
                            local_180[2] = (RTCHitN)local_170[2];
                            local_180[3] = (RTCHitN)local_170[3];
                            local_180[4] = (RTCHitN)local_170[4];
                            local_180[5] = (RTCHitN)local_170[5];
                            local_180[6] = (RTCHitN)local_170[6];
                            local_180[7] = (RTCHitN)local_170[7];
                            local_180[8] = (RTCHitN)local_170[8];
                            local_180[9] = (RTCHitN)local_170[9];
                            local_180[10] = (RTCHitN)local_170[10];
                            local_180[0xb] = (RTCHitN)local_170[0xb];
                            local_180[0xc] = (RTCHitN)local_170[0xc];
                            local_180[0xd] = (RTCHitN)local_170[0xd];
                            local_180[0xe] = (RTCHitN)local_170[0xe];
                            local_180[0xf] = (RTCHitN)local_170[0xf];
                            local_150 = vshufps_avx(auVar135,auVar135,0xaa);
                            local_160 = local_150;
                            local_130 = vshufps_avx(auVar135,auVar135,0);
                            local_140 = local_130;
                            local_120 = local_110;
                            local_100 = local_f0;
                            local_e0 = local_2e0._0_8_;
                            uStack_d8 = local_2e0._8_8_;
                            uStack_d0 = local_2e0._16_8_;
                            uStack_c8 = local_2e0._24_8_;
                            local_c0 = local_2c0._0_8_;
                            uStack_b8 = local_2c0._8_8_;
                            uStack_b0 = local_2c0._16_8_;
                            uStack_a8 = local_2c0._24_8_;
                            auVar109 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                            uStack_9c = context->user->instID[0];
                            local_a0 = uStack_9c;
                            uStack_98 = uStack_9c;
                            uStack_94 = uStack_9c;
                            uStack_90 = uStack_9c;
                            uStack_8c = uStack_9c;
                            uStack_84 = auVar109._28_4_;
                            uVar80 = uStack_84;
                            uStack_88 = uStack_9c;
                            uStack_84 = uStack_9c;
                            uStack_7c = context->user->instPrimID[0];
                            local_80 = uStack_7c;
                            uStack_78 = uStack_7c;
                            uStack_74 = uStack_7c;
                            uStack_70 = uStack_7c;
                            uStack_6c = uStack_7c;
                            uStack_68 = uStack_7c;
                            uStack_64 = uStack_7c;
                            *(float *)(ray + k * 4 + 0x100) = fVar176;
                            local_510 = *(undefined8 *)(mm_lookupmask_ps + lVar82);
                            uStack_508 = *(undefined8 *)(mm_lookupmask_ps + lVar82 + 8);
                            local_520 = *(undefined8 *)(mm_lookupmask_ps + uVar81);
                            uStack_518 = *(undefined8 *)(mm_lookupmask_ps + uVar81 + 8);
                            local_460.valid = (int *)&local_520;
                            local_460.geometryUserPtr = pGVar13->userPtr;
                            local_460.context = context->user;
                            local_460.ray = (RTCRayN *)ray;
                            local_460.hit = local_180;
                            local_460.N = 8;
                            if (pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar13->occlusionFilterN)(&local_460);
                              auVar374 = ZEXT1664(ZEXT816(0) << 0x40);
                            }
                            auVar73._8_8_ = uStack_518;
                            auVar73._0_8_ = local_520;
                            auVar135 = vpcmpeqd_avx(auVar374._0_16_,auVar73);
                            auVar75._8_8_ = uStack_508;
                            auVar75._0_8_ = local_510;
                            auVar126 = vpcmpeqd_avx(auVar374._0_16_,auVar75);
                            auVar113._16_16_ = auVar126;
                            auVar113._0_16_ = auVar135;
                            auVar27 = auVar109 & ~auVar113;
                            if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar27 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar27 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar27 >> 0x7f,0) == '\0') &&
                                  (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                                  ) && SUB321(auVar27 >> 0xbf,0) == '\0') &&
                                (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar27[0x1f]) {
                              auVar114._0_4_ = auVar135._0_4_ ^ auVar109._0_4_;
                              auVar114._4_4_ = auVar135._4_4_ ^ auVar109._4_4_;
                              auVar114._8_4_ = auVar135._8_4_ ^ auVar109._8_4_;
                              auVar114._12_4_ = auVar135._12_4_ ^ auVar109._12_4_;
                              auVar114._16_4_ = auVar126._0_4_ ^ auVar109._16_4_;
                              auVar114._20_4_ = auVar126._4_4_ ^ auVar109._20_4_;
                              auVar114._24_4_ = auVar126._8_4_ ^ auVar109._24_4_;
                              auVar114._28_4_ = auVar126._12_4_ ^ uVar80;
                            }
                            else {
                              p_Var18 = context->args->filter;
                              if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var18)(&local_460);
                                auVar374 = ZEXT1664(ZEXT816(0) << 0x40);
                              }
                              auVar74._8_8_ = uStack_518;
                              auVar74._0_8_ = local_520;
                              auVar135 = vpcmpeqd_avx(auVar374._0_16_,auVar74);
                              auVar76._8_8_ = uStack_508;
                              auVar76._0_8_ = local_510;
                              auVar126 = vpcmpeqd_avx(auVar374._0_16_,auVar76);
                              auVar146._16_16_ = auVar126;
                              auVar146._0_16_ = auVar135;
                              auVar114._0_4_ = auVar135._0_4_ ^ auVar109._0_4_;
                              auVar114._4_4_ = auVar135._4_4_ ^ auVar109._4_4_;
                              auVar114._8_4_ = auVar135._8_4_ ^ auVar109._8_4_;
                              auVar114._12_4_ = auVar135._12_4_ ^ auVar109._12_4_;
                              auVar114._16_4_ = auVar126._0_4_ ^ auVar109._16_4_;
                              auVar114._20_4_ = auVar126._4_4_ ^ auVar109._20_4_;
                              auVar114._24_4_ = auVar126._8_4_ ^ auVar109._24_4_;
                              auVar114._28_4_ = auVar126._12_4_ ^ uVar80;
                              auVar174._8_4_ = 0xff800000;
                              auVar174._0_8_ = 0xff800000ff800000;
                              auVar174._12_4_ = 0xff800000;
                              auVar174._16_4_ = 0xff800000;
                              auVar174._20_4_ = 0xff800000;
                              auVar174._24_4_ = 0xff800000;
                              auVar174._28_4_ = 0xff800000;
                              auVar109 = vblendvps_avx(auVar174,*(undefined1 (*) [32])
                                                                 (local_460.ray + 0x100),auVar146);
                              *(undefined1 (*) [32])(local_460.ray + 0x100) = auVar109;
                            }
                            bVar67 = (auVar114 >> 0x1f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar68 = (auVar114 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar66 = (auVar114 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar65 = SUB321(auVar114 >> 0x7f,0) != '\0';
                            bVar64 = (auVar114 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0;
                            bVar61 = SUB321(auVar114 >> 0xbf,0) != '\0';
                            bVar60 = (auVar114 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0;
                            bVar88 = auVar114[0x1f] < '\0';
                            if (((((((!bVar67 && !bVar68) && !bVar66) && !bVar65) && !bVar64) &&
                                 !bVar61) && !bVar60) && !bVar88) {
                              *(float *)(ray + k * 4 + 0x100) = fVar202;
                            }
                            bVar88 = ((((((bVar67 || bVar68) || bVar66) || bVar65) || bVar64) ||
                                      bVar61) || bVar60) || bVar88;
                          }
                          bVar77 = (bool)(bVar77 | bVar88);
                        }
                      }
                    }
                    break;
                  }
                  lVar83 = lVar83 + -1;
                } while (lVar83 != 0);
              }
              goto LAB_01005714;
            }
          }
          goto LAB_01005a90;
        }
      }
LAB_01005714:
    } while (bVar59);
    local_3e0 = vinsertps_avx(ZEXT416((uint)fVar177),ZEXT416((uint)fVar175),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }